

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  uint uVar3;
  float *pfVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  size_t k;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [28];
  bool bVar74;
  int iVar75;
  float *vertices;
  long lVar76;
  ulong uVar77;
  long lVar78;
  undefined1 (*pauVar79) [32];
  ulong uVar80;
  uint uVar81;
  undefined4 uVar82;
  ulong unaff_R12;
  NodeRef root;
  ulong uVar83;
  ulong *puVar84;
  float fVar85;
  float fVar86;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar112;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 in_ZMM2 [64];
  undefined1 auVar123 [64];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar130 [32];
  float fVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  undefined1 auVar165 [32];
  undefined1 auVar164 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  float fVar171;
  undefined1 auVar170 [64];
  undefined1 auVar173 [32];
  float fVar172;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_60a1;
  ulong local_60a0;
  long local_6098;
  RTCFilterFunctionNArguments local_6090;
  undefined1 local_6060 [32];
  RayK<8> *local_6030;
  int local_6024;
  undefined1 local_6020 [8];
  float fStack_6018;
  float fStack_6014;
  float fStack_6010;
  float fStack_600c;
  float fStack_6008;
  undefined1 local_6000 [32];
  undefined1 (*local_5fc8) [32];
  undefined1 local_5fc0 [32];
  BVH *local_5fa0;
  Intersectors *local_5f98;
  ulong local_5f90;
  Scene *local_5f88;
  undefined1 local_5f80 [32];
  undefined1 local_5f60 [32];
  undefined1 local_5f40 [32];
  undefined1 local_5f20 [32];
  undefined1 local_5f00 [32];
  undefined1 local_5ee0 [32];
  undefined1 local_5ec0 [32];
  undefined1 local_5ea0 [32];
  undefined1 local_5e80 [8];
  float fStack_5e78;
  float fStack_5e74;
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  undefined1 local_5e60 [32];
  undefined1 local_5e40 [32];
  undefined1 local_5e20 [32];
  undefined1 local_5e00 [32];
  undefined1 local_5de0 [32];
  undefined1 local_5dc0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_5da0;
  RTCRayQueryContext local_5d80 [4];
  RTCRayN local_5d60 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5d40;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  uint local_5c80;
  uint uStack_5c7c;
  uint uStack_5c78;
  uint uStack_5c74;
  uint uStack_5c70;
  uint uStack_5c6c;
  uint uStack_5c68;
  uint uStack_5c64;
  uint local_5c60;
  uint uStack_5c5c;
  uint uStack_5c58;
  uint uStack_5c54;
  uint uStack_5c50;
  uint uStack_5c4c;
  uint uStack_5c48;
  uint uStack_5c44;
  uint local_5c40;
  uint uStack_5c3c;
  uint uStack_5c38;
  uint uStack_5c34;
  uint uStack_5c30;
  uint uStack_5c2c;
  uint uStack_5c28;
  uint uStack_5c24;
  undefined1 local_5c20 [32];
  int local_5c00 [24];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ba0;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined1 local_5ac0 [8];
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  undefined1 local_5aa0 [8];
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  float fStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  float fStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar96 [32];
  undefined1 auVar160 [32];
  
  local_5fa0 = (BVH *)This->ptr;
  local_5808 = (local_5fa0->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar122 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar104 = ZEXT816(0) << 0x40;
      auVar134 = vpcmpeqd_avx2(auVar122,(undefined1  [32])valid_i->field_0);
      auVar122 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar104),5);
      auVar105 = auVar134 & auVar122;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0x7f,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0xbf,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar105[0x1f] < '\0') {
        auVar122 = vandps_avx(auVar122,auVar134);
        auVar17 = vpackssdw_avx(auVar122._0_16_,auVar122._16_16_);
        auVar123 = ZEXT1664(auVar17);
        local_5ba0._0_8_ = *(undefined8 *)ray;
        local_5ba0._8_8_ = *(undefined8 *)(ray + 8);
        local_5ba0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_5ba0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_5ba0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_5ba0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_5ba0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_5ba0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_5ba0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_5ba0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_5ba0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_5ba0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_5b40 = *(undefined1 (*) [32])(ray + 0x80);
        local_5b20 = *(undefined1 (*) [32])(ray + 0xa0);
        local_5c20._8_4_ = 0x7fffffff;
        local_5c20._0_8_ = 0x7fffffff7fffffff;
        local_5c20._12_4_ = 0x7fffffff;
        local_5c20._16_4_ = 0x7fffffff;
        local_5c20._20_4_ = 0x7fffffff;
        local_5c20._24_4_ = 0x7fffffff;
        local_5c20._28_4_ = 0x7fffffff;
        auVar164._8_4_ = 0x219392ef;
        auVar164._0_8_ = 0x219392ef219392ef;
        auVar164._12_4_ = 0x219392ef;
        auVar164._16_4_ = 0x219392ef;
        auVar164._20_4_ = 0x219392ef;
        auVar164._24_4_ = 0x219392ef;
        auVar164._28_4_ = 0x219392ef;
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        local_5b00 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar115 = vdivps_avx(auVar168,local_5b40);
        auVar122 = vandps_avx(local_5c20,local_5b40);
        auVar105 = vcmpps_avx(auVar122,auVar164,1);
        auVar122 = vandps_avx(local_5c20,local_5b20);
        auVar134 = vcmpps_avx(auVar122,auVar164,1);
        auVar153 = ZEXT3264(auVar134);
        auVar116 = vdivps_avx(auVar168,local_5b20);
        auVar122 = vandps_avx(local_5c20,local_5b00);
        auVar160._8_4_ = 0x5d5e0b6b;
        auVar160._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar160._12_4_ = 0x5d5e0b6b;
        auVar160._16_4_ = 0x5d5e0b6b;
        auVar160._20_4_ = 0x5d5e0b6b;
        auVar160._24_4_ = 0x5d5e0b6b;
        auVar160._28_4_ = 0x5d5e0b6b;
        auVar162 = ZEXT3264(auVar160);
        _local_5ae0 = vblendvps_avx(auVar115,auVar160,auVar105);
        auVar122 = vcmpps_avx(auVar122,auVar164,1);
        auVar105 = vdivps_avx(auVar168,local_5b00);
        _local_5ac0 = vblendvps_avx(auVar116,auVar160,auVar134);
        _local_5aa0 = vblendvps_avx(auVar105,auVar160,auVar122);
        auVar122 = vcmpps_avx(_local_5ae0,ZEXT1632(auVar104),1);
        auVar116._8_4_ = 0x20;
        auVar116._0_8_ = 0x2000000020;
        auVar116._12_4_ = 0x20;
        auVar116._16_4_ = 0x20;
        auVar116._20_4_ = 0x20;
        auVar116._24_4_ = 0x20;
        auVar116._28_4_ = 0x20;
        local_5a80 = vandps_avx(auVar122,auVar116);
        auVar105 = ZEXT1632(auVar104);
        auVar122 = vcmpps_avx(_local_5ac0,auVar105,5);
        auVar134._8_4_ = 0x40;
        auVar134._0_8_ = 0x4000000040;
        auVar134._12_4_ = 0x40;
        auVar134._16_4_ = 0x40;
        auVar134._20_4_ = 0x40;
        auVar134._24_4_ = 0x40;
        auVar134._28_4_ = 0x40;
        auVar147._8_4_ = 0x60;
        auVar147._0_8_ = 0x6000000060;
        auVar147._12_4_ = 0x60;
        auVar147._16_4_ = 0x60;
        auVar147._20_4_ = 0x60;
        auVar147._24_4_ = 0x60;
        auVar147._28_4_ = 0x60;
        local_5a60 = vblendvps_avx(auVar147,auVar134,auVar122);
        auVar122 = vcmpps_avx(_local_5aa0,auVar105,5);
        auVar115._8_4_ = 0x80;
        auVar115._0_8_ = 0x8000000080;
        auVar115._12_4_ = 0x80;
        auVar115._16_4_ = 0x80;
        auVar115._20_4_ = 0x80;
        auVar115._24_4_ = 0x80;
        auVar115._28_4_ = 0x80;
        auVar96._8_4_ = 0xa0;
        auVar96._0_8_ = 0xa0000000a0;
        auVar96._12_4_ = 0xa0;
        auVar96._16_4_ = 0xa0;
        auVar96._20_4_ = 0xa0;
        auVar96._24_4_ = 0xa0;
        auVar96._28_4_ = 0xa0;
        auVar149 = ZEXT3264(auVar96);
        local_5a40 = vblendvps_avx(auVar96,auVar115,auVar122);
        auVar122 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar105);
        local_59e0 = vpmovsxwd_avx2(auVar17);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar166 = ZEXT3264(local_4680);
        local_5a20 = vblendvps_avx(local_4680,auVar122,local_59e0);
        auVar122 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar105);
        auVar105._8_4_ = 0xff800000;
        auVar105._0_8_ = 0xff800000ff800000;
        auVar105._12_4_ = 0xff800000;
        auVar105._16_4_ = 0xff800000;
        auVar105._20_4_ = 0xff800000;
        auVar105._24_4_ = 0xff800000;
        auVar105._28_4_ = 0xff800000;
        local_5a00 = vblendvps_avx(auVar105,auVar122,local_59e0);
        auVar104 = vpcmpeqd_avx(local_5a00._0_16_,local_5a00._0_16_);
        local_5f60 = vpmovsxwd_avx2(auVar17 ^ auVar104);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar81 = 7;
        }
        else {
          uVar81 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        local_6030 = ray + 0x100;
        puVar84 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar79 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5a20;
        local_59a0 = mm_lookupmask_ps._16_8_;
        uStack_5998 = mm_lookupmask_ps._24_8_;
        uStack_5990 = mm_lookupmask_ps._16_8_;
        uStack_5988 = mm_lookupmask_ps._24_8_;
        local_5fc8 = (undefined1 (*) [32])&local_5c60;
        local_59c0 = mm_lookupmask_pd._0_8_;
        uStack_59b8 = mm_lookupmask_pd._8_8_;
        uStack_59b0 = mm_lookupmask_pd._0_8_;
        uStack_59a8 = mm_lookupmask_pd._8_8_;
        auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_5f98 = This;
LAB_016a7896:
        do {
          do {
            root.ptr = puVar84[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_016a8e4a;
            puVar84 = puVar84 + -1;
            pauVar79 = pauVar79 + -1;
            local_6000 = *pauVar79;
            auVar174 = ZEXT3264(local_6000);
            auVar122 = vcmpps_avx(local_6000,local_5a00,1);
          } while ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar122 >> 0x7f,0) == '\0') &&
                     (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar122 >> 0xbf,0) == '\0') &&
                   (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar122[0x1f]);
          uVar82 = vmovmskps_avx(auVar122);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar82);
          if (uVar81 < (uint)POPCOUNT(uVar82)) {
LAB_016a78d3:
            do {
              iVar75 = 4;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_016a8e4a;
                auVar122 = vcmpps_avx(local_5a00,auVar174._0_32_,6);
                if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar122 >> 0x7f,0) == '\0') &&
                      (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar122 >> 0xbf,0) == '\0') &&
                    (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar122[0x1f]) goto LAB_016a7896;
                local_5f90 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar122 = vpcmpeqd_avx2(auVar122,auVar122);
                lVar76 = (root.ptr & 0xfffffffffffffff0) + 0x50;
                unaff_R12 = 0;
                local_5f40 = auVar122 ^ local_5f60;
                goto LAB_016a7acb;
              }
              uVar77 = 8;
              auVar122 = auVar166._0_32_;
              for (lVar76 = 0;
                  (auVar174 = ZEXT3264(auVar122), lVar76 != 8 &&
                  (uVar83 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar76 * 8), uVar83 != 8));
                  lVar76 = lVar76 + 1) {
                uVar82 = *(undefined4 *)(root.ptr + 0x40 + lVar76 * 4);
                auVar87._4_4_ = uVar82;
                auVar87._0_4_ = uVar82;
                auVar87._8_4_ = uVar82;
                auVar87._12_4_ = uVar82;
                auVar87._16_4_ = uVar82;
                auVar87._20_4_ = uVar82;
                auVar87._24_4_ = uVar82;
                auVar87._28_4_ = uVar82;
                auVar65._8_8_ = local_5ba0._8_8_;
                auVar65._0_8_ = local_5ba0._0_8_;
                auVar65._16_8_ = local_5ba0._16_8_;
                auVar65._24_8_ = local_5ba0._24_8_;
                auVar66._8_8_ = local_5ba0._40_8_;
                auVar66._0_8_ = local_5ba0._32_8_;
                auVar66._16_8_ = local_5ba0._48_8_;
                auVar66._24_8_ = local_5ba0._56_8_;
                auVar67._8_8_ = local_5ba0._72_8_;
                auVar67._0_8_ = local_5ba0._64_8_;
                auVar67._16_8_ = local_5ba0._80_8_;
                auVar67._24_8_ = local_5ba0._88_8_;
                auVar105 = vsubps_avx(auVar87,auVar65);
                auVar174._0_4_ = (float)local_5ae0._0_4_ * auVar105._0_4_;
                auVar174._4_4_ = (float)local_5ae0._4_4_ * auVar105._4_4_;
                auVar174._8_4_ = fStack_5ad8 * auVar105._8_4_;
                auVar174._12_4_ = fStack_5ad4 * auVar105._12_4_;
                auVar174._16_4_ = fStack_5ad0 * auVar105._16_4_;
                auVar174._20_4_ = fStack_5acc * auVar105._20_4_;
                auVar174._28_36_ = auVar149._28_36_;
                auVar174._24_4_ = fStack_5ac8 * auVar105._24_4_;
                auVar115 = auVar174._0_32_;
                auVar149 = ZEXT3264(auVar115);
                uVar82 = *(undefined4 *)(root.ptr + 0x80 + lVar76 * 4);
                auVar88._4_4_ = uVar82;
                auVar88._0_4_ = uVar82;
                auVar88._8_4_ = uVar82;
                auVar88._12_4_ = uVar82;
                auVar88._16_4_ = uVar82;
                auVar88._20_4_ = uVar82;
                auVar88._24_4_ = uVar82;
                auVar88._28_4_ = uVar82;
                auVar105 = vsubps_avx(auVar88,auVar66);
                auVar154._0_4_ = (float)local_5ac0._0_4_ * auVar105._0_4_;
                auVar154._4_4_ = (float)local_5ac0._4_4_ * auVar105._4_4_;
                auVar154._8_4_ = fStack_5ab8 * auVar105._8_4_;
                auVar154._12_4_ = fStack_5ab4 * auVar105._12_4_;
                auVar154._16_4_ = fStack_5ab0 * auVar105._16_4_;
                auVar154._20_4_ = fStack_5aac * auVar105._20_4_;
                auVar154._28_36_ = auVar153._28_36_;
                auVar154._24_4_ = fStack_5aa8 * auVar105._24_4_;
                auVar116 = auVar154._0_32_;
                auVar153 = ZEXT3264(auVar116);
                uVar82 = *(undefined4 *)(root.ptr + 0xc0 + lVar76 * 4);
                auVar89._4_4_ = uVar82;
                auVar89._0_4_ = uVar82;
                auVar89._8_4_ = uVar82;
                auVar89._12_4_ = uVar82;
                auVar89._16_4_ = uVar82;
                auVar89._20_4_ = uVar82;
                auVar89._24_4_ = uVar82;
                auVar89._28_4_ = uVar82;
                auVar105 = vsubps_avx(auVar89,auVar67);
                auVar163._0_4_ = (float)local_5aa0._0_4_ * auVar105._0_4_;
                auVar163._4_4_ = (float)local_5aa0._4_4_ * auVar105._4_4_;
                auVar163._8_4_ = fStack_5a98 * auVar105._8_4_;
                auVar163._12_4_ = fStack_5a94 * auVar105._12_4_;
                auVar163._16_4_ = fStack_5a90 * auVar105._16_4_;
                auVar163._20_4_ = fStack_5a8c * auVar105._20_4_;
                auVar163._28_36_ = auVar162._28_36_;
                auVar163._24_4_ = fStack_5a88 * auVar105._24_4_;
                auVar147 = auVar163._0_32_;
                auVar162 = ZEXT3264(auVar147);
                uVar82 = *(undefined4 *)(root.ptr + 0x60 + lVar76 * 4);
                auVar90._4_4_ = uVar82;
                auVar90._0_4_ = uVar82;
                auVar90._8_4_ = uVar82;
                auVar90._12_4_ = uVar82;
                auVar90._16_4_ = uVar82;
                auVar90._20_4_ = uVar82;
                auVar90._24_4_ = uVar82;
                auVar90._28_4_ = uVar82;
                auVar105 = vsubps_avx(auVar90,auVar65);
                auVar21._4_4_ = (float)local_5ae0._4_4_ * auVar105._4_4_;
                auVar21._0_4_ = (float)local_5ae0._0_4_ * auVar105._0_4_;
                auVar21._8_4_ = fStack_5ad8 * auVar105._8_4_;
                auVar21._12_4_ = fStack_5ad4 * auVar105._12_4_;
                auVar21._16_4_ = fStack_5ad0 * auVar105._16_4_;
                auVar21._20_4_ = fStack_5acc * auVar105._20_4_;
                auVar21._24_4_ = fStack_5ac8 * auVar105._24_4_;
                auVar21._28_4_ = (int)((ulong)local_5ba0._24_8_ >> 0x20);
                uVar82 = *(undefined4 *)(root.ptr + 0xa0 + lVar76 * 4);
                auVar91._4_4_ = uVar82;
                auVar91._0_4_ = uVar82;
                auVar91._8_4_ = uVar82;
                auVar91._12_4_ = uVar82;
                auVar91._16_4_ = uVar82;
                auVar91._20_4_ = uVar82;
                auVar91._24_4_ = uVar82;
                auVar91._28_4_ = uVar82;
                auVar105 = vsubps_avx(auVar91,auVar66);
                auVar22._4_4_ = (float)local_5ac0._4_4_ * auVar105._4_4_;
                auVar22._0_4_ = (float)local_5ac0._0_4_ * auVar105._0_4_;
                auVar22._8_4_ = fStack_5ab8 * auVar105._8_4_;
                auVar22._12_4_ = fStack_5ab4 * auVar105._12_4_;
                auVar22._16_4_ = fStack_5ab0 * auVar105._16_4_;
                auVar22._20_4_ = fStack_5aac * auVar105._20_4_;
                auVar22._24_4_ = fStack_5aa8 * auVar105._24_4_;
                auVar22._28_4_ = (int)((ulong)local_5ba0._56_8_ >> 0x20);
                uVar82 = *(undefined4 *)(root.ptr + 0xe0 + lVar76 * 4);
                auVar92._4_4_ = uVar82;
                auVar92._0_4_ = uVar82;
                auVar92._8_4_ = uVar82;
                auVar92._12_4_ = uVar82;
                auVar92._16_4_ = uVar82;
                auVar92._20_4_ = uVar82;
                auVar92._24_4_ = uVar82;
                auVar92._28_4_ = uVar82;
                auVar105 = vsubps_avx(auVar92,auVar67);
                auVar23._4_4_ = (float)local_5aa0._4_4_ * auVar105._4_4_;
                auVar23._0_4_ = (float)local_5aa0._0_4_ * auVar105._0_4_;
                auVar23._8_4_ = fStack_5a98 * auVar105._8_4_;
                auVar23._12_4_ = fStack_5a94 * auVar105._12_4_;
                auVar23._16_4_ = fStack_5a90 * auVar105._16_4_;
                auVar23._20_4_ = fStack_5a8c * auVar105._20_4_;
                auVar23._24_4_ = fStack_5a88 * auVar105._24_4_;
                auVar23._28_4_ = (int)((ulong)local_5ba0._88_8_ >> 0x20);
                auVar105 = vminps_avx(auVar115,auVar21);
                auVar134 = vminps_avx(auVar116,auVar22);
                auVar105 = vmaxps_avx(auVar105,auVar134);
                auVar134 = vminps_avx(auVar147,auVar23);
                auVar105 = vmaxps_avx(auVar105,auVar134);
                auVar24._4_4_ = auVar169._4_4_ * auVar105._4_4_;
                auVar24._0_4_ = auVar169._0_4_ * auVar105._0_4_;
                auVar24._8_4_ = auVar169._8_4_ * auVar105._8_4_;
                auVar24._12_4_ = auVar169._12_4_ * auVar105._12_4_;
                auVar24._16_4_ = auVar169._16_4_ * auVar105._16_4_;
                auVar24._20_4_ = auVar169._20_4_ * auVar105._20_4_;
                auVar24._24_4_ = auVar169._24_4_ * auVar105._24_4_;
                auVar24._28_4_ = auVar105._28_4_;
                auVar105 = vmaxps_avx(auVar115,auVar21);
                auVar134 = vmaxps_avx(auVar116,auVar22);
                auVar134 = vminps_avx(auVar105,auVar134);
                auVar105 = vmaxps_avx(auVar147,auVar23);
                auVar105 = vminps_avx(auVar134,auVar105);
                auVar25._4_4_ = auVar170._4_4_ * auVar105._4_4_;
                auVar25._0_4_ = auVar170._0_4_ * auVar105._0_4_;
                auVar25._8_4_ = auVar170._8_4_ * auVar105._8_4_;
                auVar25._12_4_ = auVar170._12_4_ * auVar105._12_4_;
                auVar25._16_4_ = auVar170._16_4_ * auVar105._16_4_;
                auVar25._20_4_ = auVar170._20_4_ * auVar105._20_4_;
                auVar25._24_4_ = auVar170._24_4_ * auVar105._24_4_;
                auVar25._28_4_ = auVar105._28_4_;
                auVar105 = vmaxps_avx(auVar24,local_5a20);
                auVar123 = ZEXT3264(auVar105);
                auVar134 = vminps_avx(auVar25,local_5a00);
                auVar134 = vcmpps_avx(auVar105,auVar134,2);
                uVar80 = uVar77;
                auVar105 = auVar122;
                if (((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar134 >> 0x7f,0) != '\0') ||
                       (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar134 >> 0xbf,0) != '\0') ||
                     (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar134[0x1f] < '\0') &&
                   (auVar105 = vblendvps_avx(auVar166._0_32_,auVar24,auVar134), uVar80 = uVar83,
                   uVar77 != 8)) {
                  *puVar84 = uVar77;
                  puVar84 = puVar84 + 1;
                  *pauVar79 = auVar122;
                  pauVar79 = pauVar79 + 1;
                }
                auVar122 = auVar105;
                uVar77 = uVar80;
              }
              if (uVar77 == 8) goto LAB_016a7a5e;
              auVar105 = vcmpps_avx(local_5a00,auVar122,6);
              uVar82 = vmovmskps_avx(auVar105);
              root.ptr = uVar77;
            } while ((byte)uVar81 < (byte)POPCOUNT(uVar82));
            *puVar84 = uVar77;
            puVar84 = puVar84 + 1;
            *pauVar79 = auVar122;
            pauVar79 = pauVar79 + 1;
          }
          else {
            while (unaff_R12 != 0) {
              k = 0;
              for (uVar77 = unaff_R12; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              unaff_R12 = unaff_R12 - 1 & unaff_R12;
              local_6060._0_8_ = k;
              auVar123 = ZEXT1664(auVar123._0_16_);
              auVar149 = ZEXT1664(auVar149._0_16_);
              auVar153 = ZEXT1664(auVar153._0_16_);
              auVar162 = ZEXT1664(auVar162._0_16_);
              bVar74 = occluded1(local_5f98,local_5fa0,root,k,&local_60a1,ray,
                                 (TravRayK<8,_true> *)&local_5ba0.field_0,context);
              if (bVar74) {
                *(undefined4 *)(local_5f60 + local_6060._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar122 = _DAT_01f7b020 & ~local_5f60;
            iVar75 = 3;
            auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar174 = ZEXT3264(local_6000);
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar122 >> 0x7f,0) != '\0') ||
                  (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar122 >> 0xbf,0) != '\0') ||
                (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar122[0x1f] < '\0') {
              auVar122._8_4_ = 0xff800000;
              auVar122._0_8_ = 0xff800000ff800000;
              auVar122._12_4_ = 0xff800000;
              auVar122._16_4_ = 0xff800000;
              auVar122._20_4_ = 0xff800000;
              auVar122._24_4_ = 0xff800000;
              auVar122._28_4_ = 0xff800000;
              auVar123 = ZEXT3264(auVar122);
              local_5a00 = vblendvps_avx(local_5a00,auVar122,local_5f60);
              iVar75 = 2;
            }
            unaff_R12 = 0;
            if (uVar81 < (uint)POPCOUNT(uVar82)) goto LAB_016a78d3;
          }
LAB_016a7a5e:
        } while (iVar75 != 3);
LAB_016a8e4a:
        auVar122 = vandps_avx(local_59e0,local_5f60);
        auVar111._8_4_ = 0xff800000;
        auVar111._0_8_ = 0xff800000ff800000;
        auVar111._12_4_ = 0xff800000;
        auVar111._16_4_ = 0xff800000;
        auVar111._20_4_ = 0xff800000;
        auVar111._24_4_ = 0xff800000;
        auVar111._28_4_ = 0xff800000;
        auVar122 = vmaskmovps_avx(auVar122,auVar111);
        *(undefined1 (*) [32])local_6030 = auVar122;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_016a7acb:
  do {
    lVar78 = -0x10;
    auVar122 = auVar123._0_32_;
    if (unaff_R12 == local_5f90) break;
    local_5f88 = context->scene;
    auVar123 = ZEXT3264(local_5f40);
    local_60a0 = unaff_R12;
    while( true ) {
      auVar105 = auVar123._0_32_;
      if ((lVar78 == 0) || (iVar75 = *(int *)(lVar76 + 0x10 + lVar78), iVar75 == -1)) break;
      uVar83 = CONCAT44(0,*(uint *)(lVar76 + lVar78));
      local_5f80._0_8_ = uVar83;
      pfVar4 = (local_5f88->vertices).items[uVar83];
      uVar77 = (ulong)*(uint *)(lVar76 + -0x40 + lVar78);
      fVar85 = pfVar4[uVar77];
      auVar93._4_4_ = fVar85;
      auVar93._0_4_ = fVar85;
      auVar93._8_4_ = fVar85;
      auVar93._12_4_ = fVar85;
      auVar93._16_4_ = fVar85;
      auVar93._20_4_ = fVar85;
      auVar93._24_4_ = fVar85;
      auVar93._28_4_ = fVar85;
      fVar85 = pfVar4[uVar77 + 1];
      auVar113._4_4_ = fVar85;
      auVar113._0_4_ = fVar85;
      auVar113._8_4_ = fVar85;
      auVar113._12_4_ = fVar85;
      auVar113._16_4_ = fVar85;
      auVar113._20_4_ = fVar85;
      auVar113._24_4_ = fVar85;
      auVar113._28_4_ = fVar85;
      fVar85 = pfVar4[uVar77 + 2];
      auVar130._4_4_ = fVar85;
      auVar130._0_4_ = fVar85;
      auVar130._8_4_ = fVar85;
      auVar130._12_4_ = fVar85;
      auVar130._16_4_ = fVar85;
      auVar130._20_4_ = fVar85;
      auVar130._24_4_ = fVar85;
      auVar130._28_4_ = fVar85;
      uVar77 = (ulong)*(uint *)(lVar76 + -0x10 + lVar78);
      fVar85 = pfVar4[uVar77];
      local_5f20._4_4_ = fVar85;
      local_5f20._0_4_ = fVar85;
      local_5f20._8_4_ = fVar85;
      local_5f20._12_4_ = fVar85;
      local_5f20._16_4_ = fVar85;
      local_5f20._20_4_ = fVar85;
      local_5f20._24_4_ = fVar85;
      local_5f20._28_4_ = fVar85;
      fVar85 = pfVar4[uVar77 + 1];
      local_5840._4_4_ = fVar85;
      local_5840._0_4_ = fVar85;
      local_5840._8_4_ = fVar85;
      local_5840._12_4_ = fVar85;
      local_5840._16_4_ = fVar85;
      local_5840._20_4_ = fVar85;
      local_5840._24_4_ = fVar85;
      local_5840._28_4_ = fVar85;
      fVar85 = pfVar4[uVar77 + 2];
      local_5860._4_4_ = fVar85;
      local_5860._0_4_ = fVar85;
      local_5860._8_4_ = fVar85;
      local_5860._12_4_ = fVar85;
      local_5860._16_4_ = fVar85;
      local_5860._20_4_ = fVar85;
      local_5860._24_4_ = fVar85;
      local_5860._28_4_ = fVar85;
      auVar122 = *(undefined1 (*) [32])ray;
      auVar134 = *(undefined1 (*) [32])(ray + 0x20);
      auVar115 = *(undefined1 (*) [32])(ray + 0x40);
      local_5dc0 = vsubps_avx(auVar93,auVar122);
      local_5de0 = vsubps_avx(auVar113,auVar134);
      local_5e00 = vsubps_avx(auVar130,auVar115);
      auVar116 = vsubps_avx(local_5840,auVar134);
      auVar147 = vsubps_avx(local_5860,auVar115);
      local_5e40 = vsubps_avx(auVar116,local_5de0);
      local_5e20 = vsubps_avx(auVar147,local_5e00);
      auVar161._0_4_ = auVar116._0_4_ + local_5de0._0_4_;
      auVar161._4_4_ = auVar116._4_4_ + local_5de0._4_4_;
      auVar161._8_4_ = auVar116._8_4_ + local_5de0._8_4_;
      auVar161._12_4_ = auVar116._12_4_ + local_5de0._12_4_;
      auVar161._16_4_ = auVar116._16_4_ + local_5de0._16_4_;
      auVar161._20_4_ = auVar116._20_4_ + local_5de0._20_4_;
      auVar161._24_4_ = auVar116._24_4_ + local_5de0._24_4_;
      auVar161._28_4_ = auVar116._28_4_ + local_5de0._28_4_;
      fVar8 = local_5e00._0_4_;
      auVar167._0_4_ = auVar147._0_4_ + fVar8;
      fVar9 = local_5e00._4_4_;
      auVar167._4_4_ = auVar147._4_4_ + fVar9;
      fVar10 = local_5e00._8_4_;
      auVar167._8_4_ = auVar147._8_4_ + fVar10;
      fVar11 = local_5e00._12_4_;
      auVar167._12_4_ = auVar147._12_4_ + fVar11;
      fVar12 = local_5e00._16_4_;
      auVar167._16_4_ = auVar147._16_4_ + fVar12;
      fVar13 = local_5e00._20_4_;
      auVar167._20_4_ = auVar147._20_4_ + fVar13;
      fVar86 = local_5e00._24_4_;
      auVar167._24_4_ = auVar147._24_4_ + fVar86;
      fVar142 = auVar147._28_4_;
      auVar167._28_4_ = fVar142 + local_5e00._28_4_;
      auVar123._0_4_ = auVar161._0_4_ * local_5e20._0_4_;
      auVar123._4_4_ = auVar161._4_4_ * local_5e20._4_4_;
      auVar123._8_4_ = auVar161._8_4_ * local_5e20._8_4_;
      auVar123._12_4_ = auVar161._12_4_ * local_5e20._12_4_;
      auVar123._16_4_ = auVar161._16_4_ * local_5e20._16_4_;
      auVar123._20_4_ = auVar161._20_4_ * local_5e20._20_4_;
      auVar123._28_36_ = auVar170._28_36_;
      auVar123._24_4_ = auVar161._24_4_ * local_5e20._24_4_;
      auVar17 = vfmsub231ps_fma(auVar123._0_32_,local_5e40,auVar167);
      auVar96 = vsubps_avx(local_5f20,auVar122);
      local_5e60 = vsubps_avx(auVar96,local_5dc0);
      auVar148._4_4_ = auVar167._4_4_ * local_5e60._4_4_;
      auVar148._0_4_ = auVar167._0_4_ * local_5e60._0_4_;
      auVar148._8_4_ = auVar167._8_4_ * local_5e60._8_4_;
      auVar148._12_4_ = auVar167._12_4_ * local_5e60._12_4_;
      auVar148._16_4_ = auVar167._16_4_ * local_5e60._16_4_;
      auVar148._20_4_ = auVar167._20_4_ * local_5e60._20_4_;
      auVar148._24_4_ = auVar167._24_4_ * local_5e60._24_4_;
      auVar148._28_4_ = auVar167._28_4_;
      auVar173._0_4_ = auVar96._0_4_ + local_5dc0._0_4_;
      auVar173._4_4_ = auVar96._4_4_ + local_5dc0._4_4_;
      auVar173._8_4_ = auVar96._8_4_ + local_5dc0._8_4_;
      auVar173._12_4_ = auVar96._12_4_ + local_5dc0._12_4_;
      auVar173._16_4_ = auVar96._16_4_ + local_5dc0._16_4_;
      auVar173._20_4_ = auVar96._20_4_ + local_5dc0._20_4_;
      auVar173._24_4_ = auVar96._24_4_ + local_5dc0._24_4_;
      auVar173._28_4_ = auVar96._28_4_ + local_5dc0._28_4_;
      auVar104 = vfmsub231ps_fma(auVar148,local_5e20,auVar173);
      auVar26._4_4_ = auVar173._4_4_ * local_5e40._4_4_;
      auVar26._0_4_ = auVar173._0_4_ * local_5e40._0_4_;
      auVar26._8_4_ = auVar173._8_4_ * local_5e40._8_4_;
      auVar26._12_4_ = auVar173._12_4_ * local_5e40._12_4_;
      auVar26._16_4_ = auVar173._16_4_ * local_5e40._16_4_;
      auVar26._20_4_ = auVar173._20_4_ * local_5e40._20_4_;
      auVar26._24_4_ = auVar173._24_4_ * local_5e40._24_4_;
      auVar26._28_4_ = auVar173._28_4_;
      auVar18 = vfmsub231ps_fma(auVar26,local_5e60,auVar161);
      pRVar1 = ray + 0xc0;
      fVar112 = *(float *)pRVar1;
      fVar124 = *(float *)(ray + 0xc4);
      fVar125 = *(float *)(ray + 200);
      fVar126 = *(float *)(ray + 0xcc);
      fVar127 = *(float *)(ray + 0xd0);
      fVar128 = *(float *)(ray + 0xd4);
      fVar129 = *(float *)(ray + 0xd8);
      auVar73 = *(undefined1 (*) [28])pRVar1;
      _local_5e80 = *(undefined1 (*) [32])pRVar1;
      auVar27._4_4_ = auVar18._4_4_ * fVar124;
      auVar27._0_4_ = auVar18._0_4_ * fVar112;
      auVar27._8_4_ = auVar18._8_4_ * fVar125;
      auVar27._12_4_ = auVar18._12_4_ * fVar126;
      auVar27._16_4_ = fVar127 * 0.0;
      auVar27._20_4_ = fVar128 * 0.0;
      auVar27._24_4_ = fVar129 * 0.0;
      auVar27._28_4_ = auVar161._28_4_;
      _local_6020 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar104 = vfmadd231ps_fma(auVar27,_local_6020,ZEXT1632(auVar104));
      uVar77 = (ulong)*(uint *)(lVar76 + -0x30 + lVar78);
      fVar85 = pfVar4[uVar77];
      local_5880._4_4_ = fVar85;
      local_5880._0_4_ = fVar85;
      local_5880._8_4_ = fVar85;
      local_5880._12_4_ = fVar85;
      local_5880._16_4_ = fVar85;
      local_5880._20_4_ = fVar85;
      local_5880._24_4_ = fVar85;
      local_5880._28_4_ = fVar85;
      local_5ea0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_5ea0,ZEXT1632(auVar17));
      auVar160 = vsubps_avx(local_5880,auVar122);
      fVar85 = pfVar4[uVar77 + 1];
      local_58a0._4_4_ = fVar85;
      local_58a0._0_4_ = fVar85;
      local_58a0._8_4_ = fVar85;
      local_58a0._12_4_ = fVar85;
      local_58a0._16_4_ = fVar85;
      local_58a0._20_4_ = fVar85;
      local_58a0._24_4_ = fVar85;
      local_58a0._28_4_ = fVar85;
      auVar134 = vsubps_avx(local_58a0,auVar134);
      fVar85 = pfVar4[uVar77 + 2];
      local_58c0._4_4_ = fVar85;
      local_58c0._0_4_ = fVar85;
      local_58c0._8_4_ = fVar85;
      local_58c0._12_4_ = fVar85;
      local_58c0._16_4_ = fVar85;
      local_58c0._20_4_ = fVar85;
      local_58c0._24_4_ = fVar85;
      local_58c0._28_4_ = fVar85;
      auVar115 = vsubps_avx(local_58c0,auVar115);
      local_5ec0 = vsubps_avx(local_5de0,auVar134);
      local_5ee0 = vsubps_avx(local_5e00,auVar115);
      auVar143._0_4_ = local_5de0._0_4_ + auVar134._0_4_;
      auVar143._4_4_ = local_5de0._4_4_ + auVar134._4_4_;
      auVar143._8_4_ = local_5de0._8_4_ + auVar134._8_4_;
      auVar143._12_4_ = local_5de0._12_4_ + auVar134._12_4_;
      auVar143._16_4_ = local_5de0._16_4_ + auVar134._16_4_;
      auVar143._20_4_ = local_5de0._20_4_ + auVar134._20_4_;
      auVar143._24_4_ = local_5de0._24_4_ + auVar134._24_4_;
      auVar143._28_4_ = local_5de0._28_4_ + auVar134._28_4_;
      auVar155._0_4_ = fVar8 + auVar115._0_4_;
      auVar155._4_4_ = fVar9 + auVar115._4_4_;
      auVar155._8_4_ = fVar10 + auVar115._8_4_;
      auVar155._12_4_ = fVar11 + auVar115._12_4_;
      auVar155._16_4_ = fVar12 + auVar115._16_4_;
      auVar155._20_4_ = fVar13 + auVar115._20_4_;
      auVar155._24_4_ = fVar86 + auVar115._24_4_;
      auVar155._28_4_ = local_5e00._28_4_ + auVar115._28_4_;
      fVar172 = local_5ee0._0_4_;
      fVar175 = local_5ee0._4_4_;
      auVar28._4_4_ = fVar175 * auVar143._4_4_;
      auVar28._0_4_ = fVar172 * auVar143._0_4_;
      fVar176 = local_5ee0._8_4_;
      auVar28._8_4_ = fVar176 * auVar143._8_4_;
      fVar177 = local_5ee0._12_4_;
      auVar28._12_4_ = fVar177 * auVar143._12_4_;
      fVar178 = local_5ee0._16_4_;
      auVar28._16_4_ = fVar178 * auVar143._16_4_;
      fVar179 = local_5ee0._20_4_;
      auVar28._20_4_ = fVar179 * auVar143._20_4_;
      fVar180 = local_5ee0._24_4_;
      auVar28._24_4_ = fVar180 * auVar143._24_4_;
      auVar28._28_4_ = auVar122._28_4_;
      auVar18 = vfmsub231ps_fma(auVar28,local_5ec0,auVar155);
      auVar164 = vsubps_avx(local_5dc0,auVar160);
      fVar85 = auVar164._0_4_;
      fVar101 = auVar164._4_4_;
      auVar29._4_4_ = auVar155._4_4_ * fVar101;
      auVar29._0_4_ = auVar155._0_4_ * fVar85;
      fVar102 = auVar164._8_4_;
      auVar29._8_4_ = auVar155._8_4_ * fVar102;
      fVar103 = auVar164._12_4_;
      auVar29._12_4_ = auVar155._12_4_ * fVar103;
      fVar14 = auVar164._16_4_;
      auVar29._16_4_ = auVar155._16_4_ * fVar14;
      fVar15 = auVar164._20_4_;
      auVar29._20_4_ = auVar155._20_4_ * fVar15;
      fVar16 = auVar164._24_4_;
      auVar29._24_4_ = auVar155._24_4_ * fVar16;
      auVar29._28_4_ = auVar155._28_4_;
      auVar150._0_4_ = local_5dc0._0_4_ + auVar160._0_4_;
      auVar150._4_4_ = local_5dc0._4_4_ + auVar160._4_4_;
      auVar150._8_4_ = local_5dc0._8_4_ + auVar160._8_4_;
      auVar150._12_4_ = local_5dc0._12_4_ + auVar160._12_4_;
      auVar150._16_4_ = local_5dc0._16_4_ + auVar160._16_4_;
      auVar150._20_4_ = local_5dc0._20_4_ + auVar160._20_4_;
      auVar150._24_4_ = local_5dc0._24_4_ + auVar160._24_4_;
      auVar150._28_4_ = local_5dc0._28_4_ + auVar160._28_4_;
      auVar17 = vfmsub231ps_fma(auVar29,local_5ee0,auVar150);
      fVar136 = local_5ec0._0_4_;
      fVar137 = local_5ec0._4_4_;
      auVar30._4_4_ = fVar137 * auVar150._4_4_;
      auVar30._0_4_ = fVar136 * auVar150._0_4_;
      fVar138 = local_5ec0._8_4_;
      auVar30._8_4_ = fVar138 * auVar150._8_4_;
      fVar139 = local_5ec0._12_4_;
      auVar30._12_4_ = fVar139 * auVar150._12_4_;
      fVar140 = local_5ec0._16_4_;
      auVar30._16_4_ = fVar140 * auVar150._16_4_;
      fVar141 = local_5ec0._20_4_;
      auVar30._20_4_ = fVar141 * auVar150._20_4_;
      fVar171 = local_5ec0._24_4_;
      auVar30._24_4_ = fVar171 * auVar150._24_4_;
      auVar30._28_4_ = auVar150._28_4_;
      auVar19 = vfmsub231ps_fma(auVar30,auVar164,auVar143);
      auVar31._4_4_ = fVar124 * auVar19._4_4_;
      auVar31._0_4_ = fVar112 * auVar19._0_4_;
      auVar31._8_4_ = fVar125 * auVar19._8_4_;
      auVar31._12_4_ = fVar126 * auVar19._12_4_;
      auVar31._16_4_ = fVar127 * 0.0;
      auVar31._20_4_ = fVar128 * 0.0;
      auVar31._24_4_ = fVar129 * 0.0;
      auVar31._28_4_ = auVar143._28_4_;
      auVar17 = vfmadd231ps_fma(auVar31,_local_6020,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_5ea0,ZEXT1632(auVar18));
      auVar168 = vsubps_avx(auVar160,auVar96);
      auVar94._0_4_ = auVar160._0_4_ + auVar96._0_4_;
      auVar94._4_4_ = auVar160._4_4_ + auVar96._4_4_;
      auVar94._8_4_ = auVar160._8_4_ + auVar96._8_4_;
      auVar94._12_4_ = auVar160._12_4_ + auVar96._12_4_;
      auVar94._16_4_ = auVar160._16_4_ + auVar96._16_4_;
      auVar94._20_4_ = auVar160._20_4_ + auVar96._20_4_;
      auVar94._24_4_ = auVar160._24_4_ + auVar96._24_4_;
      auVar94._28_4_ = auVar160._28_4_ + auVar96._28_4_;
      auVar153 = ZEXT3264(local_5c20);
      auVar96 = vsubps_avx(auVar134,auVar116);
      auVar106._0_4_ = auVar116._0_4_ + auVar134._0_4_;
      auVar106._4_4_ = auVar116._4_4_ + auVar134._4_4_;
      auVar106._8_4_ = auVar116._8_4_ + auVar134._8_4_;
      auVar106._12_4_ = auVar116._12_4_ + auVar134._12_4_;
      auVar106._16_4_ = auVar116._16_4_ + auVar134._16_4_;
      auVar106._20_4_ = auVar116._20_4_ + auVar134._20_4_;
      auVar106._24_4_ = auVar116._24_4_ + auVar134._24_4_;
      auVar106._28_4_ = auVar116._28_4_ + auVar134._28_4_;
      auVar160 = vsubps_avx(auVar115,auVar147);
      auVar114._0_4_ = auVar115._0_4_ + auVar147._0_4_;
      auVar114._4_4_ = auVar115._4_4_ + auVar147._4_4_;
      auVar114._8_4_ = auVar115._8_4_ + auVar147._8_4_;
      auVar114._12_4_ = auVar115._12_4_ + auVar147._12_4_;
      auVar114._16_4_ = auVar115._16_4_ + auVar147._16_4_;
      auVar114._20_4_ = auVar115._20_4_ + auVar147._20_4_;
      auVar114._24_4_ = auVar115._24_4_ + auVar147._24_4_;
      auVar114._28_4_ = auVar115._28_4_ + fVar142;
      auVar32._4_4_ = auVar160._4_4_ * auVar106._4_4_;
      auVar32._0_4_ = auVar160._0_4_ * auVar106._0_4_;
      auVar32._8_4_ = auVar160._8_4_ * auVar106._8_4_;
      auVar32._12_4_ = auVar160._12_4_ * auVar106._12_4_;
      auVar32._16_4_ = auVar160._16_4_ * auVar106._16_4_;
      auVar32._20_4_ = auVar160._20_4_ * auVar106._20_4_;
      auVar32._24_4_ = auVar160._24_4_ * auVar106._24_4_;
      auVar32._28_4_ = fVar142;
      auVar19 = vfmsub231ps_fma(auVar32,auVar96,auVar114);
      auVar33._4_4_ = auVar168._4_4_ * auVar114._4_4_;
      auVar33._0_4_ = auVar168._0_4_ * auVar114._0_4_;
      auVar33._8_4_ = auVar168._8_4_ * auVar114._8_4_;
      auVar33._12_4_ = auVar168._12_4_ * auVar114._12_4_;
      auVar33._16_4_ = auVar168._16_4_ * auVar114._16_4_;
      auVar33._20_4_ = auVar168._20_4_ * auVar114._20_4_;
      auVar33._24_4_ = auVar168._24_4_ * auVar114._24_4_;
      auVar33._28_4_ = auVar114._28_4_;
      auVar18 = vfmsub231ps_fma(auVar33,auVar160,auVar94);
      auVar34._4_4_ = auVar96._4_4_ * auVar94._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * auVar94._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * auVar94._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * auVar94._12_4_;
      auVar34._16_4_ = auVar96._16_4_ * auVar94._16_4_;
      auVar34._20_4_ = auVar96._20_4_ * auVar94._20_4_;
      auVar34._24_4_ = auVar96._24_4_ * auVar94._24_4_;
      auVar34._28_4_ = auVar94._28_4_;
      auVar20 = vfmsub231ps_fma(auVar34,auVar168,auVar106);
      auVar95._0_4_ = fVar112 * auVar20._0_4_;
      auVar95._4_4_ = fVar124 * auVar20._4_4_;
      auVar95._8_4_ = fVar125 * auVar20._8_4_;
      auVar95._12_4_ = fVar126 * auVar20._12_4_;
      auVar95._16_4_ = fVar127 * 0.0;
      auVar95._20_4_ = fVar128 * 0.0;
      auVar95._24_4_ = fVar129 * 0.0;
      auVar95._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar95,_local_6020,ZEXT1632(auVar18));
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_5ea0,ZEXT1632(auVar19));
      auVar147 = ZEXT1632(CONCAT412(auVar18._12_4_ + auVar104._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar18._8_4_ + auVar104._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar18._4_4_ + auVar104._4_4_ + auVar17._4_4_
                                                      ,auVar18._0_4_ +
                                                       auVar104._0_4_ + auVar17._0_4_))));
      auVar149 = ZEXT3264(auVar147);
      local_5940 = ZEXT1632(auVar104);
      auVar122 = vminps_avx(local_5940,ZEXT1632(auVar17));
      auVar134 = vminps_avx(auVar122,ZEXT1632(auVar18));
      auVar122 = vandps_avx(auVar147,local_5c20);
      fVar112 = auVar122._0_4_ * 1.1920929e-07;
      fVar124 = auVar122._4_4_ * 1.1920929e-07;
      auVar35._4_4_ = fVar124;
      auVar35._0_4_ = fVar112;
      fVar125 = auVar122._8_4_ * 1.1920929e-07;
      auVar35._8_4_ = fVar125;
      fVar126 = auVar122._12_4_ * 1.1920929e-07;
      auVar35._12_4_ = fVar126;
      fVar127 = auVar122._16_4_ * 1.1920929e-07;
      auVar35._16_4_ = fVar127;
      fVar128 = auVar122._20_4_ * 1.1920929e-07;
      auVar35._20_4_ = fVar128;
      fVar129 = auVar122._24_4_ * 1.1920929e-07;
      auVar35._24_4_ = fVar129;
      auVar35._28_4_ = 0x34000000;
      local_6000._8_4_ = 0x80000000;
      local_6000._0_8_ = 0x8000000080000000;
      local_6000._12_4_ = 0x80000000;
      local_6000._16_4_ = 0x80000000;
      local_6000._20_4_ = 0x80000000;
      local_6000._24_4_ = 0x80000000;
      local_6000._28_4_ = 0x80000000;
      auVar131._0_8_ = CONCAT44(fVar124,fVar112) ^ 0x8000000080000000;
      auVar131._8_4_ = -fVar125;
      auVar131._12_4_ = -fVar126;
      auVar131._16_4_ = -fVar127;
      auVar131._20_4_ = -fVar128;
      auVar131._24_4_ = -fVar129;
      auVar131._28_4_ = 0xb4000000;
      auVar134 = vcmpps_avx(auVar134,auVar131,5);
      auVar116 = vmaxps_avx(local_5940,ZEXT1632(auVar17));
      auVar162 = ZEXT3264(auVar105);
      auVar115 = vmaxps_avx(auVar116,ZEXT1632(auVar18));
      auVar115 = vcmpps_avx(auVar115,auVar35,2);
      auVar134 = vorps_avx(auVar134,auVar115);
      uVar77 = (ulong)*(uint *)(lVar76 + -0x20 + lVar78);
      auVar115 = auVar105 & auVar134;
      local_58e0 = pfVar4[uVar77];
      local_5900 = pfVar4[uVar77 + 1];
      local_5920 = pfVar4[uVar77 + 2];
      local_6098 = lVar78;
      local_6060 = auVar105;
      local_6024 = iVar75;
      fStack_591c = local_5920;
      fStack_5918 = local_5920;
      fStack_5914 = local_5920;
      fStack_5910 = local_5920;
      fStack_590c = local_5920;
      fStack_5908 = local_5920;
      fStack_5904 = local_5920;
      fStack_58fc = local_5900;
      fStack_58f8 = local_5900;
      fStack_58f4 = local_5900;
      fStack_58f0 = local_5900;
      fStack_58ec = local_5900;
      fStack_58e8 = local_5900;
      fStack_58e4 = local_5900;
      fStack_58dc = local_58e0;
      fStack_58d8 = local_58e0;
      fStack_58d4 = local_58e0;
      fStack_58d0 = local_58e0;
      fStack_58cc = local_58e0;
      fStack_58c8 = local_58e0;
      fStack_58c4 = local_58e0;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0x7f,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar115 >> 0xbf,0) == '\0') &&
          (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar115[0x1f]) {
        auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        auVar36._4_4_ = fVar137 * local_5e20._4_4_;
        auVar36._0_4_ = fVar136 * local_5e20._0_4_;
        auVar36._8_4_ = fVar138 * local_5e20._8_4_;
        auVar36._12_4_ = fVar139 * local_5e20._12_4_;
        auVar36._16_4_ = fVar140 * local_5e20._16_4_;
        auVar36._20_4_ = fVar141 * local_5e20._20_4_;
        auVar36._24_4_ = fVar171 * local_5e20._24_4_;
        auVar36._28_4_ = local_5920;
        auVar37._4_4_ = fVar101 * local_5e40._4_4_;
        auVar37._0_4_ = fVar85 * local_5e40._0_4_;
        auVar37._8_4_ = fVar102 * local_5e40._8_4_;
        auVar37._12_4_ = fVar103 * local_5e40._12_4_;
        auVar37._16_4_ = fVar14 * local_5e40._16_4_;
        auVar37._20_4_ = fVar15 * local_5e40._20_4_;
        auVar37._24_4_ = fVar16 * local_5e40._24_4_;
        auVar37._28_4_ = auVar134._28_4_;
        auVar18 = vfmsub213ps_fma(local_5e40,local_5ee0,auVar36);
        auVar38._4_4_ = auVar96._4_4_ * fVar175;
        auVar38._0_4_ = auVar96._0_4_ * fVar172;
        auVar38._8_4_ = auVar96._8_4_ * fVar176;
        auVar38._12_4_ = auVar96._12_4_ * fVar177;
        auVar38._16_4_ = auVar96._16_4_ * fVar178;
        auVar38._20_4_ = auVar96._20_4_ * fVar179;
        auVar38._24_4_ = auVar96._24_4_ * fVar180;
        auVar38._28_4_ = 0x34000000;
        auVar39._4_4_ = fVar101 * auVar160._4_4_;
        auVar39._0_4_ = fVar85 * auVar160._0_4_;
        auVar39._8_4_ = fVar102 * auVar160._8_4_;
        auVar39._12_4_ = fVar103 * auVar160._12_4_;
        auVar39._16_4_ = fVar14 * auVar160._16_4_;
        auVar39._20_4_ = fVar15 * auVar160._20_4_;
        auVar39._24_4_ = fVar16 * auVar160._24_4_;
        auVar39._28_4_ = auVar116._28_4_;
        auVar19 = vfmsub213ps_fma(auVar160,local_5ec0,auVar38);
        auVar115 = vandps_avx(auVar36,local_5c20);
        auVar116 = vandps_avx(auVar38,local_5c20);
        auVar115 = vcmpps_avx(auVar115,auVar116,1);
        local_5d40.field_0.x.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar18),auVar115);
        auVar40._4_4_ = auVar168._4_4_ * fVar137;
        auVar40._0_4_ = auVar168._0_4_ * fVar136;
        auVar40._8_4_ = auVar168._8_4_ * fVar138;
        auVar40._12_4_ = auVar168._12_4_ * fVar139;
        auVar40._16_4_ = auVar168._16_4_ * fVar140;
        auVar40._20_4_ = auVar168._20_4_ * fVar141;
        auVar40._24_4_ = auVar168._24_4_ * fVar171;
        auVar40._28_4_ = auVar115._28_4_;
        auVar18 = vfmsub213ps_fma(auVar168,local_5ee0,auVar39);
        auVar41._4_4_ = fVar175 * local_5e60._4_4_;
        auVar41._0_4_ = fVar172 * local_5e60._0_4_;
        auVar41._8_4_ = fVar176 * local_5e60._8_4_;
        auVar41._12_4_ = fVar177 * local_5e60._12_4_;
        auVar41._16_4_ = fVar178 * local_5e60._16_4_;
        auVar41._20_4_ = fVar179 * local_5e60._20_4_;
        auVar41._24_4_ = fVar180 * local_5e60._24_4_;
        auVar41._28_4_ = auVar116._28_4_;
        auVar19 = vfmsub213ps_fma(local_5e20,auVar164,auVar41);
        auVar115 = vandps_avx(auVar41,local_5c20);
        auVar116 = vandps_avx(auVar39,local_5c20);
        auVar115 = vcmpps_avx(auVar115,auVar116,1);
        local_5d40.field_0.y.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19),auVar115);
        auVar149 = ZEXT3264((undefined1  [32])local_5d40.field_0.y.field_0);
        auVar18 = vfmsub213ps_fma(local_5e60,local_5ec0,auVar37);
        auVar19 = vfmsub213ps_fma(auVar96,auVar164,auVar40);
        auVar115 = vandps_avx(auVar37,local_5c20);
        auVar116 = vandps_avx(auVar40,local_5c20);
        auVar116 = vcmpps_avx(auVar115,auVar116,1);
        local_5d40.field_0.z.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar18),auVar116);
        auVar153 = ZEXT3264((undefined1  [32])local_5d40.field_0.z.field_0);
        local_5e80._0_4_ = auVar73._0_4_;
        local_5e80._4_4_ = auVar73._4_4_;
        fStack_5e78 = auVar73._8_4_;
        fStack_5e74 = auVar73._12_4_;
        fStack_5e70 = auVar73._16_4_;
        fStack_5e6c = auVar73._20_4_;
        fStack_5e68 = auVar73._24_4_;
        auVar42._4_4_ = local_5d40._68_4_ * (float)local_5e80._4_4_;
        auVar42._0_4_ = local_5d40._64_4_ * (float)local_5e80._0_4_;
        auVar42._8_4_ = local_5d40._72_4_ * fStack_5e78;
        auVar42._12_4_ = local_5d40._76_4_ * fStack_5e74;
        auVar42._16_4_ = local_5d40._80_4_ * fStack_5e70;
        auVar42._20_4_ = local_5d40._84_4_ * fStack_5e6c;
        auVar42._24_4_ = local_5d40._88_4_ * fStack_5e68;
        auVar42._28_4_ = auVar116._28_4_;
        auVar18 = vfmadd213ps_fma(_local_6020,(undefined1  [32])local_5d40.field_0.y.field_0,auVar42
                                 );
        auVar18 = vfmadd213ps_fma(local_5ea0,(undefined1  [32])local_5d40.field_0.x.field_0,
                                  ZEXT1632(auVar18));
        fVar85 = auVar18._0_4_ + auVar18._0_4_;
        fVar101 = auVar18._4_4_ + auVar18._4_4_;
        fVar102 = auVar18._8_4_ + auVar18._8_4_;
        fVar103 = auVar18._12_4_ + auVar18._12_4_;
        auVar96 = ZEXT1632(CONCAT412(fVar103,CONCAT48(fVar102,CONCAT44(fVar101,fVar85))));
        auVar43._4_4_ = local_5d40._68_4_ * fVar9;
        auVar43._0_4_ = local_5d40._64_4_ * fVar8;
        auVar43._8_4_ = local_5d40._72_4_ * fVar10;
        auVar43._12_4_ = local_5d40._76_4_ * fVar11;
        auVar43._16_4_ = local_5d40._80_4_ * fVar12;
        auVar43._20_4_ = local_5d40._84_4_ * fVar13;
        auVar43._24_4_ = local_5d40._88_4_ * fVar86;
        auVar43._28_4_ = auVar115._28_4_;
        auVar18 = vfmadd213ps_fma(local_5de0,(undefined1  [32])local_5d40.field_0.y.field_0,auVar43)
        ;
        auVar19 = vfmadd213ps_fma(local_5dc0,(undefined1  [32])local_5d40.field_0.x.field_0,
                                  ZEXT1632(auVar18));
        auVar115 = vrcpps_avx(auVar96);
        auVar156._8_4_ = 0x3f800000;
        auVar156._0_8_ = 0x3f8000003f800000;
        auVar156._12_4_ = 0x3f800000;
        auVar156._16_4_ = 0x3f800000;
        auVar156._20_4_ = 0x3f800000;
        auVar156._24_4_ = 0x3f800000;
        auVar156._28_4_ = 0x3f800000;
        auVar18 = vfnmadd213ps_fma(auVar115,auVar96,auVar156);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar115,auVar115);
        local_5ce0 = ZEXT1632(CONCAT412((auVar19._12_4_ + auVar19._12_4_) * auVar18._12_4_,
                                        CONCAT48((auVar19._8_4_ + auVar19._8_4_) * auVar18._8_4_,
                                                 CONCAT44((auVar19._4_4_ + auVar19._4_4_) *
                                                          auVar18._4_4_,
                                                          (auVar19._0_4_ + auVar19._0_4_) *
                                                          auVar18._0_4_))));
        auVar115 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_5ce0,2);
        auVar116 = vcmpps_avx(local_5ce0,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar115 = vandps_avx(auVar115,auVar116);
        auVar132._0_8_ = CONCAT44(fVar101,fVar85) ^ 0x8000000080000000;
        auVar132._8_4_ = -fVar102;
        auVar132._12_4_ = -fVar103;
        auVar132._16_4_ = 0x80000000;
        auVar132._20_4_ = 0x80000000;
        auVar132._24_4_ = 0x80000000;
        auVar132._28_4_ = 0x80000000;
        auVar116 = vcmpps_avx(auVar96,auVar132,4);
        auVar115 = vandps_avx(auVar116,auVar115);
        auVar105 = vandps_avx(auVar105,auVar134);
        auVar115 = vpslld_avx2(auVar115,0x1f);
        auVar116 = vpsrad_avx2(auVar115,0x1f);
        auVar115 = auVar105 & auVar116;
        local_5f00 = auVar134;
        local_5980 = auVar122;
        local_5960 = auVar147;
        if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar115 >> 0x7f,0) == '\0') &&
              (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar115 >> 0xbf,0) == '\0') &&
            (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar115[0x1f]) {
          auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          auVar105 = vandps_avx(auVar116,auVar105);
          pGVar5 = (context->scene->geometries).items[uVar83].ptr;
          uVar2 = pGVar5->mask;
          auVar117._4_4_ = uVar2;
          auVar117._0_4_ = uVar2;
          auVar117._8_4_ = uVar2;
          auVar117._12_4_ = uVar2;
          auVar117._16_4_ = uVar2;
          auVar117._20_4_ = uVar2;
          auVar117._24_4_ = uVar2;
          auVar117._28_4_ = uVar2;
          auVar134 = vpand_avx2(auVar117,*(undefined1 (*) [32])(ray + 0x120));
          auVar115 = vpcmpeqd_avx2(auVar134,_DAT_01f7b000);
          auVar134 = auVar105 & ~auVar115;
          auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar134 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar134 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar134 >> 0x7f,0) != '\0') ||
                (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar134 >> 0xbf,0) != '\0') ||
              (auVar134 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar134[0x1f] < '\0') {
            auVar105 = vandnps_avx(auVar115,auVar105);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar134 = vrcpps_avx(auVar147);
              auVar159._8_4_ = 0x3f800000;
              auVar159._0_8_ = 0x3f8000003f800000;
              auVar159._12_4_ = 0x3f800000;
              auVar159._16_4_ = 0x3f800000;
              auVar159._20_4_ = 0x3f800000;
              auVar159._24_4_ = 0x3f800000;
              auVar159._28_4_ = 0x3f800000;
              auVar18 = vfnmadd213ps_fma(auVar147,auVar134,auVar159);
              auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar134,auVar134);
              auVar98._8_4_ = 0x219392ef;
              auVar98._0_8_ = 0x219392ef219392ef;
              auVar98._12_4_ = 0x219392ef;
              auVar98._16_4_ = 0x219392ef;
              auVar98._20_4_ = 0x219392ef;
              auVar98._24_4_ = 0x219392ef;
              auVar98._28_4_ = 0x219392ef;
              auVar134 = vcmpps_avx(auVar122,auVar98,5);
              auVar134 = vandps_avx(auVar134,ZEXT1632(auVar18));
              auVar61._4_4_ = auVar134._4_4_ * auVar104._4_4_;
              auVar61._0_4_ = auVar134._0_4_ * auVar104._0_4_;
              auVar61._8_4_ = auVar134._8_4_ * auVar104._8_4_;
              auVar61._12_4_ = auVar134._12_4_ * auVar104._12_4_;
              auVar61._16_4_ = auVar134._16_4_ * 0.0;
              auVar61._20_4_ = auVar134._20_4_ * 0.0;
              auVar61._24_4_ = auVar134._24_4_ * 0.0;
              auVar61._28_4_ = auVar122._28_4_;
              auVar122 = vminps_avx(auVar61,auVar159);
              auVar62._4_4_ = auVar17._4_4_ * auVar134._4_4_;
              auVar62._0_4_ = auVar17._0_4_ * auVar134._0_4_;
              auVar62._8_4_ = auVar17._8_4_ * auVar134._8_4_;
              auVar62._12_4_ = auVar17._12_4_ * auVar134._12_4_;
              auVar62._16_4_ = auVar134._16_4_ * 0.0;
              auVar62._20_4_ = auVar134._20_4_ * 0.0;
              auVar62._24_4_ = auVar134._24_4_ * 0.0;
              auVar62._28_4_ = auVar134._28_4_;
              auVar134 = vminps_avx(auVar62,auVar159);
              auVar115 = vsubps_avx(auVar159,auVar122);
              auVar116 = vsubps_avx(auVar159,auVar134);
              auVar69._8_8_ = uStack_5998;
              auVar69._0_8_ = local_59a0;
              auVar69._16_8_ = uStack_5990;
              auVar69._24_8_ = uStack_5988;
              local_5ca0 = vblendvps_avx(auVar122,auVar115,auVar69);
              local_5cc0 = vblendvps_avx(auVar134,auVar116,auVar69);
              local_6090.valid = local_5c00;
              local_6090.geometryUserPtr = &local_5da0;
              local_6090.context = local_5d80;
              local_6090.ray = local_5d60;
              auVar149 = ZEXT1664(local_5d40._32_16_);
              auVar153 = ZEXT1664(local_5d40._64_16_);
              _local_6020 = auVar105;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_6090,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_5d40.field_0);
              pRVar6 = context->user;
              local_5ca0._4_4_ = local_6024;
              local_5ca0._0_4_ = local_6024;
              local_5ca0._8_4_ = local_6024;
              local_5ca0._12_4_ = local_6024;
              local_5ca0._16_4_ = local_6024;
              local_5ca0._20_4_ = local_6024;
              local_5ca0._24_4_ = local_6024;
              local_5ca0._28_4_ = local_6024;
              local_5c80 = local_5f80._0_4_;
              uStack_5c7c = local_5f80._0_4_;
              uStack_5c78 = local_5f80._0_4_;
              uStack_5c74 = local_5f80._0_4_;
              uStack_5c70 = local_5f80._0_4_;
              uStack_5c6c = local_5f80._0_4_;
              uStack_5c68 = local_5f80._0_4_;
              uStack_5c64 = local_5f80._0_4_;
              auVar134 = vpcmpeqd_avx2(local_5ca0,local_5ca0);
              local_5fc8[1] = auVar134;
              *local_5fc8 = auVar134;
              local_5c60 = pRVar6->instID[0];
              local_5c40 = pRVar6->instPrimID[0];
              auVar122 = *(undefined1 (*) [32])(ray + 0x100);
              auVar105 = vblendvps_avx(auVar122,(undefined1  [32])local_5da0,_local_6020);
              *(undefined1 (*) [32])(ray + 0x100) = auVar105;
              local_5fc0 = _local_6020;
              local_6090.valid = (int *)local_5fc0;
              local_6090.geometryUserPtr = pGVar5->userPtr;
              local_6090.context = context->user;
              local_6090.N = 8;
              local_6090.ray = (RTCRayN *)ray;
              local_6090.hit = (RTCHitN *)&local_5d40;
              uStack_5c5c = local_5c60;
              uStack_5c58 = local_5c60;
              uStack_5c54 = local_5c60;
              uStack_5c50 = local_5c60;
              uStack_5c4c = local_5c60;
              uStack_5c48 = local_5c60;
              uStack_5c44 = local_5c60;
              uStack_5c3c = local_5c40;
              uStack_5c38 = local_5c40;
              uStack_5c34 = local_5c40;
              uStack_5c30 = local_5c40;
              uStack_5c2c = local_5c40;
              uStack_5c28 = local_5c40;
              uStack_5c24 = local_5c40;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar149 = ZEXT1664(auVar149._0_16_);
                auVar153 = ZEXT1664(auVar153._0_16_);
                _local_6020 = auVar122;
                (*pGVar5->occlusionFilterN)(&local_6090);
                auVar162._8_56_ = extraout_var;
                auVar162._0_8_ = extraout_XMM1_Qa;
                auVar134 = vpcmpeqd_avx2(auVar162._0_32_,auVar162._0_32_);
                auVar122 = _local_6020;
              }
              unaff_R12 = local_60a0;
              auVar105 = vpcmpeqd_avx2(local_5fc0,_DAT_01f7b000);
              auVar115 = auVar134 & ~auVar105;
              if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar115 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar115 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar115 >> 0x7f,0) == '\0') &&
                    (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar115 >> 0xbf,0) == '\0') &&
                  (auVar115 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar115[0x1f]) {
                auVar105 = auVar105 ^ auVar134;
                auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              }
              else {
                p_Var7 = context->args->filter;
                if (p_Var7 == (RTCFilterFunctionN)0x0) {
                  auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                }
                else {
                  auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    auVar149 = ZEXT1664(auVar149._0_16_);
                    auVar153 = ZEXT1664(auVar153._0_16_);
                    _local_6020 = auVar122;
                    (*p_Var7)(&local_6090);
                    auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                    auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                  CONCAT424(0x3f7ffffa,
                                                            CONCAT420(0x3f7ffffa,
                                                                      CONCAT416(0x3f7ffffa,
                                                                                CONCAT412(0x3f7ffffa
                                                                                          ,CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                  CONCAT424(0x7f800000,
                                                            CONCAT420(0x7f800000,
                                                                      CONCAT416(0x7f800000,
                                                                                CONCAT412(0x7f800000
                                                                                          ,CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar122 = _local_6020;
                  }
                }
                auVar134 = vpcmpeqd_avx2(local_5fc0,_DAT_01f7b000);
                auVar105 = auVar134 ^ _DAT_01f7b020;
                auVar109._8_4_ = 0xff800000;
                auVar109._0_8_ = 0xff800000ff800000;
                auVar109._12_4_ = 0xff800000;
                auVar109._16_4_ = 0xff800000;
                auVar109._20_4_ = 0xff800000;
                auVar109._24_4_ = 0xff800000;
                auVar109._28_4_ = 0xff800000;
                auVar134 = vblendvps_avx(auVar109,*(undefined1 (*) [32])(local_6090.ray + 0x100),
                                         auVar134);
                *(undefined1 (*) [32])(local_6090.ray + 0x100) = auVar134;
              }
              auVar122 = vblendvps_avx(auVar122,*(undefined1 (*) [32])local_6030,auVar105);
              *(undefined1 (*) [32])local_6030 = auVar122;
            }
            auVar122 = vandnps_avx(auVar105,local_6060);
            auVar162 = ZEXT3264(auVar122);
          }
        }
      }
      auVar105 = auVar162._0_32_;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar162 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar162 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar162[0x1f]) break;
      auVar122 = *(undefined1 (*) [32])ray;
      auVar134 = *(undefined1 (*) [32])(ray + 0x20);
      auVar115 = *(undefined1 (*) [32])(ray + 0x40);
      auVar72._4_4_ = fStack_58dc;
      auVar72._0_4_ = local_58e0;
      auVar72._8_4_ = fStack_58d8;
      auVar72._12_4_ = fStack_58d4;
      auVar72._16_4_ = fStack_58d0;
      auVar72._20_4_ = fStack_58cc;
      auVar72._24_4_ = fStack_58c8;
      auVar72._28_4_ = fStack_58c4;
      local_5de0 = vsubps_avx(auVar72,auVar122);
      auVar71._4_4_ = fStack_58fc;
      auVar71._0_4_ = local_5900;
      auVar71._8_4_ = fStack_58f8;
      auVar71._12_4_ = fStack_58f4;
      auVar71._16_4_ = fStack_58f0;
      auVar71._20_4_ = fStack_58ec;
      auVar71._24_4_ = fStack_58e8;
      auVar71._28_4_ = fStack_58e4;
      local_5e00 = vsubps_avx(auVar71,auVar134);
      auVar70._4_4_ = fStack_591c;
      auVar70._0_4_ = local_5920;
      auVar70._8_4_ = fStack_5918;
      auVar70._12_4_ = fStack_5914;
      auVar70._16_4_ = fStack_5910;
      auVar70._20_4_ = fStack_590c;
      auVar70._24_4_ = fStack_5908;
      auVar70._28_4_ = fStack_5904;
      local_5e20 = vsubps_avx(auVar70,auVar115);
      auVar116 = vsubps_avx(local_5f20,auVar122);
      auVar147 = vsubps_avx(local_5840,auVar134);
      auVar96 = vsubps_avx(local_5860,auVar115);
      auVar122 = vsubps_avx(local_5880,auVar122);
      auVar134 = vsubps_avx(local_58a0,auVar134);
      auVar115 = vsubps_avx(local_58c0,auVar115);
      local_5e40 = vsubps_avx(auVar122,local_5de0);
      _local_5e80 = vsubps_avx(auVar134,local_5e00);
      local_5e60 = vsubps_avx(auVar115,local_5e20);
      auVar107._0_4_ = local_5de0._0_4_ + auVar122._0_4_;
      auVar107._4_4_ = local_5de0._4_4_ + auVar122._4_4_;
      auVar107._8_4_ = local_5de0._8_4_ + auVar122._8_4_;
      auVar107._12_4_ = local_5de0._12_4_ + auVar122._12_4_;
      auVar107._16_4_ = local_5de0._16_4_ + auVar122._16_4_;
      auVar107._20_4_ = local_5de0._20_4_ + auVar122._20_4_;
      auVar107._24_4_ = local_5de0._24_4_ + auVar122._24_4_;
      auVar107._28_4_ = local_5de0._28_4_ + auVar122._28_4_;
      auVar157._0_4_ = auVar134._0_4_ + local_5e00._0_4_;
      auVar157._4_4_ = auVar134._4_4_ + local_5e00._4_4_;
      auVar157._8_4_ = auVar134._8_4_ + local_5e00._8_4_;
      auVar157._12_4_ = auVar134._12_4_ + local_5e00._12_4_;
      auVar157._16_4_ = auVar134._16_4_ + local_5e00._16_4_;
      auVar157._20_4_ = auVar134._20_4_ + local_5e00._20_4_;
      auVar157._24_4_ = auVar134._24_4_ + local_5e00._24_4_;
      fVar86 = local_5e00._28_4_;
      auVar157._28_4_ = auVar134._28_4_ + fVar86;
      fVar85 = local_5e20._0_4_;
      auVar165._0_4_ = auVar115._0_4_ + fVar85;
      fVar8 = local_5e20._4_4_;
      auVar165._4_4_ = auVar115._4_4_ + fVar8;
      fVar9 = local_5e20._8_4_;
      auVar165._8_4_ = auVar115._8_4_ + fVar9;
      fVar10 = local_5e20._12_4_;
      auVar165._12_4_ = auVar115._12_4_ + fVar10;
      fVar11 = local_5e20._16_4_;
      auVar165._16_4_ = auVar115._16_4_ + fVar11;
      fVar12 = local_5e20._20_4_;
      auVar165._20_4_ = auVar115._20_4_ + fVar12;
      fVar13 = local_5e20._24_4_;
      auVar165._24_4_ = auVar115._24_4_ + fVar13;
      auVar165._28_4_ = auVar115._28_4_ + local_5e20._28_4_;
      auVar153._0_4_ = auVar157._0_4_ * local_5e60._0_4_;
      auVar153._4_4_ = auVar157._4_4_ * local_5e60._4_4_;
      auVar153._8_4_ = auVar157._8_4_ * local_5e60._8_4_;
      auVar153._12_4_ = auVar157._12_4_ * local_5e60._12_4_;
      auVar153._16_4_ = auVar157._16_4_ * local_5e60._16_4_;
      auVar153._20_4_ = auVar157._20_4_ * local_5e60._20_4_;
      auVar153._28_36_ = auVar170._28_36_;
      auVar153._24_4_ = auVar157._24_4_ * local_5e60._24_4_;
      auVar17 = vfmsub231ps_fma(auVar153._0_32_,_local_5e80,auVar165);
      auVar149._0_4_ = auVar165._0_4_ * local_5e40._0_4_;
      auVar149._4_4_ = auVar165._4_4_ * local_5e40._4_4_;
      auVar149._8_4_ = auVar165._8_4_ * local_5e40._8_4_;
      auVar149._12_4_ = auVar165._12_4_ * local_5e40._12_4_;
      auVar149._16_4_ = auVar165._16_4_ * local_5e40._16_4_;
      auVar149._20_4_ = auVar165._20_4_ * local_5e40._20_4_;
      auVar149._28_36_ = auVar169._28_36_;
      auVar149._24_4_ = auVar165._24_4_ * local_5e40._24_4_;
      auVar104 = vfmsub231ps_fma(auVar149._0_32_,local_5e60,auVar107);
      auVar44._4_4_ = auVar107._4_4_ * local_5e80._4_4_;
      auVar44._0_4_ = auVar107._0_4_ * local_5e80._0_4_;
      auVar44._8_4_ = auVar107._8_4_ * local_5e80._8_4_;
      auVar44._12_4_ = auVar107._12_4_ * local_5e80._12_4_;
      auVar44._16_4_ = auVar107._16_4_ * local_5e80._16_4_;
      auVar44._20_4_ = auVar107._20_4_ * local_5e80._20_4_;
      auVar44._24_4_ = auVar107._24_4_ * local_5e80._24_4_;
      auVar44._28_4_ = auVar107._28_4_;
      auVar18 = vfmsub231ps_fma(auVar44,local_5e40,auVar157);
      pRVar1 = ray + 0xc0;
      fVar136 = *(float *)pRVar1;
      fVar137 = *(float *)(ray + 0xc4);
      fVar138 = *(float *)(ray + 200);
      fVar139 = *(float *)(ray + 0xcc);
      fVar140 = *(float *)(ray + 0xd0);
      fVar141 = *(float *)(ray + 0xd4);
      fVar171 = *(float *)(ray + 0xd8);
      auVar73 = *(undefined1 (*) [28])pRVar1;
      _local_6020 = *(undefined1 (*) [32])pRVar1;
      auVar45._4_4_ = auVar18._4_4_ * fVar137;
      auVar45._0_4_ = auVar18._0_4_ * fVar136;
      auVar45._8_4_ = auVar18._8_4_ * fVar138;
      auVar45._12_4_ = auVar18._12_4_ * fVar139;
      auVar45._16_4_ = fVar140 * 0.0;
      auVar45._20_4_ = fVar141 * 0.0;
      auVar45._24_4_ = fVar171 * 0.0;
      auVar45._28_4_ = local_5e60._28_4_;
      local_5f80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar104 = vfmadd231ps_fma(auVar45,local_5f80,ZEXT1632(auVar104));
      local_5dc0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_5dc0,ZEXT1632(auVar17));
      auVar162 = ZEXT1664(auVar104);
      local_5ea0 = vsubps_avx(local_5e00,auVar147);
      auVar160 = vsubps_avx(local_5e20,auVar96);
      auVar108._0_4_ = auVar147._0_4_ + local_5e00._0_4_;
      auVar108._4_4_ = auVar147._4_4_ + local_5e00._4_4_;
      auVar108._8_4_ = auVar147._8_4_ + local_5e00._8_4_;
      auVar108._12_4_ = auVar147._12_4_ + local_5e00._12_4_;
      auVar108._16_4_ = auVar147._16_4_ + local_5e00._16_4_;
      auVar108._20_4_ = auVar147._20_4_ + local_5e00._20_4_;
      auVar108._24_4_ = auVar147._24_4_ + local_5e00._24_4_;
      auVar108._28_4_ = auVar147._28_4_ + fVar86;
      auVar158._0_4_ = fVar85 + auVar96._0_4_;
      auVar158._4_4_ = fVar8 + auVar96._4_4_;
      auVar158._8_4_ = fVar9 + auVar96._8_4_;
      auVar158._12_4_ = fVar10 + auVar96._12_4_;
      auVar158._16_4_ = fVar11 + auVar96._16_4_;
      auVar158._20_4_ = fVar12 + auVar96._20_4_;
      auVar158._24_4_ = fVar13 + auVar96._24_4_;
      fVar101 = auVar96._28_4_;
      auVar158._28_4_ = local_5e20._28_4_ + fVar101;
      fVar172 = auVar160._0_4_;
      fVar175 = auVar160._4_4_;
      auVar46._4_4_ = fVar175 * auVar108._4_4_;
      auVar46._0_4_ = fVar172 * auVar108._0_4_;
      fVar176 = auVar160._8_4_;
      auVar46._8_4_ = fVar176 * auVar108._8_4_;
      fVar177 = auVar160._12_4_;
      auVar46._12_4_ = fVar177 * auVar108._12_4_;
      fVar178 = auVar160._16_4_;
      auVar46._16_4_ = fVar178 * auVar108._16_4_;
      fVar179 = auVar160._20_4_;
      auVar46._20_4_ = fVar179 * auVar108._20_4_;
      fVar180 = auVar160._24_4_;
      auVar46._24_4_ = fVar180 * auVar108._24_4_;
      auVar46._28_4_ = fVar86;
      auVar18 = vfmsub231ps_fma(auVar46,local_5ea0,auVar158);
      auVar164 = vsubps_avx(local_5de0,auVar116);
      fVar86 = auVar164._0_4_;
      fVar103 = auVar164._4_4_;
      auVar47._4_4_ = auVar158._4_4_ * fVar103;
      auVar47._0_4_ = auVar158._0_4_ * fVar86;
      fVar15 = auVar164._8_4_;
      auVar47._8_4_ = auVar158._8_4_ * fVar15;
      fVar112 = auVar164._12_4_;
      auVar47._12_4_ = auVar158._12_4_ * fVar112;
      fVar125 = auVar164._16_4_;
      auVar47._16_4_ = auVar158._16_4_ * fVar125;
      fVar127 = auVar164._20_4_;
      auVar47._20_4_ = auVar158._20_4_ * fVar127;
      fVar129 = auVar164._24_4_;
      auVar47._24_4_ = auVar158._24_4_ * fVar129;
      auVar47._28_4_ = auVar158._28_4_;
      auVar152._0_4_ = local_5de0._0_4_ + auVar116._0_4_;
      auVar152._4_4_ = local_5de0._4_4_ + auVar116._4_4_;
      auVar152._8_4_ = local_5de0._8_4_ + auVar116._8_4_;
      auVar152._12_4_ = local_5de0._12_4_ + auVar116._12_4_;
      auVar152._16_4_ = local_5de0._16_4_ + auVar116._16_4_;
      auVar152._20_4_ = local_5de0._20_4_ + auVar116._20_4_;
      auVar152._24_4_ = local_5de0._24_4_ + auVar116._24_4_;
      auVar152._28_4_ = local_5de0._28_4_ + auVar116._28_4_;
      auVar17 = vfmsub231ps_fma(auVar47,auVar160,auVar152);
      fVar102 = local_5ea0._0_4_;
      fVar14 = local_5ea0._4_4_;
      auVar48._4_4_ = auVar152._4_4_ * fVar14;
      auVar48._0_4_ = auVar152._0_4_ * fVar102;
      fVar16 = local_5ea0._8_4_;
      auVar48._8_4_ = auVar152._8_4_ * fVar16;
      fVar124 = local_5ea0._12_4_;
      auVar48._12_4_ = auVar152._12_4_ * fVar124;
      fVar126 = local_5ea0._16_4_;
      auVar48._16_4_ = auVar152._16_4_ * fVar126;
      fVar128 = local_5ea0._20_4_;
      auVar48._20_4_ = auVar152._20_4_ * fVar128;
      fVar142 = local_5ea0._24_4_;
      auVar48._24_4_ = auVar152._24_4_ * fVar142;
      auVar48._28_4_ = auVar152._28_4_;
      auVar19 = vfmsub231ps_fma(auVar48,auVar164,auVar108);
      auVar49._4_4_ = auVar19._4_4_ * fVar137;
      auVar49._0_4_ = auVar19._0_4_ * fVar136;
      auVar49._8_4_ = auVar19._8_4_ * fVar138;
      auVar49._12_4_ = auVar19._12_4_ * fVar139;
      auVar49._16_4_ = fVar140 * 0.0;
      auVar49._20_4_ = fVar141 * 0.0;
      auVar49._24_4_ = fVar171 * 0.0;
      auVar49._28_4_ = auVar108._28_4_;
      auVar17 = vfmadd231ps_fma(auVar49,local_5f80,ZEXT1632(auVar17));
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_5dc0,ZEXT1632(auVar18));
      auVar168 = vsubps_avx(auVar116,auVar122);
      auVar118._0_4_ = auVar116._0_4_ + auVar122._0_4_;
      auVar118._4_4_ = auVar116._4_4_ + auVar122._4_4_;
      auVar118._8_4_ = auVar116._8_4_ + auVar122._8_4_;
      auVar118._12_4_ = auVar116._12_4_ + auVar122._12_4_;
      auVar118._16_4_ = auVar116._16_4_ + auVar122._16_4_;
      auVar118._20_4_ = auVar116._20_4_ + auVar122._20_4_;
      auVar118._24_4_ = auVar116._24_4_ + auVar122._24_4_;
      auVar118._28_4_ = auVar116._28_4_ + auVar122._28_4_;
      auVar116 = vsubps_avx(auVar147,auVar134);
      auVar133._0_4_ = auVar147._0_4_ + auVar134._0_4_;
      auVar133._4_4_ = auVar147._4_4_ + auVar134._4_4_;
      auVar133._8_4_ = auVar147._8_4_ + auVar134._8_4_;
      auVar133._12_4_ = auVar147._12_4_ + auVar134._12_4_;
      auVar133._16_4_ = auVar147._16_4_ + auVar134._16_4_;
      auVar133._20_4_ = auVar147._20_4_ + auVar134._20_4_;
      auVar133._24_4_ = auVar147._24_4_ + auVar134._24_4_;
      auVar133._28_4_ = auVar147._28_4_ + auVar134._28_4_;
      auVar147 = vsubps_avx(auVar96,auVar115);
      auVar97._0_4_ = auVar96._0_4_ + auVar115._0_4_;
      auVar97._4_4_ = auVar96._4_4_ + auVar115._4_4_;
      auVar97._8_4_ = auVar96._8_4_ + auVar115._8_4_;
      auVar97._12_4_ = auVar96._12_4_ + auVar115._12_4_;
      auVar97._16_4_ = auVar96._16_4_ + auVar115._16_4_;
      auVar97._20_4_ = auVar96._20_4_ + auVar115._20_4_;
      auVar97._24_4_ = auVar96._24_4_ + auVar115._24_4_;
      auVar97._28_4_ = fVar101 + auVar115._28_4_;
      auVar50._4_4_ = auVar147._4_4_ * auVar133._4_4_;
      auVar50._0_4_ = auVar147._0_4_ * auVar133._0_4_;
      auVar50._8_4_ = auVar147._8_4_ * auVar133._8_4_;
      auVar50._12_4_ = auVar147._12_4_ * auVar133._12_4_;
      auVar50._16_4_ = auVar147._16_4_ * auVar133._16_4_;
      auVar50._20_4_ = auVar147._20_4_ * auVar133._20_4_;
      auVar50._24_4_ = auVar147._24_4_ * auVar133._24_4_;
      auVar50._28_4_ = fVar101;
      auVar19 = vfmsub231ps_fma(auVar50,auVar116,auVar97);
      auVar51._4_4_ = auVar168._4_4_ * auVar97._4_4_;
      auVar51._0_4_ = auVar168._0_4_ * auVar97._0_4_;
      auVar51._8_4_ = auVar168._8_4_ * auVar97._8_4_;
      auVar51._12_4_ = auVar168._12_4_ * auVar97._12_4_;
      auVar51._16_4_ = auVar168._16_4_ * auVar97._16_4_;
      auVar51._20_4_ = auVar168._20_4_ * auVar97._20_4_;
      auVar51._24_4_ = auVar168._24_4_ * auVar97._24_4_;
      auVar51._28_4_ = auVar97._28_4_;
      auVar18 = vfmsub231ps_fma(auVar51,auVar147,auVar118);
      auVar52._4_4_ = auVar118._4_4_ * auVar116._4_4_;
      auVar52._0_4_ = auVar118._0_4_ * auVar116._0_4_;
      auVar52._8_4_ = auVar118._8_4_ * auVar116._8_4_;
      auVar52._12_4_ = auVar118._12_4_ * auVar116._12_4_;
      auVar52._16_4_ = auVar118._16_4_ * auVar116._16_4_;
      auVar52._20_4_ = auVar118._20_4_ * auVar116._20_4_;
      auVar52._24_4_ = auVar118._24_4_ * auVar116._24_4_;
      auVar52._28_4_ = auVar118._28_4_;
      auVar20 = vfmsub231ps_fma(auVar52,auVar168,auVar133);
      auVar119._0_4_ = auVar20._0_4_ * fVar136;
      auVar119._4_4_ = auVar20._4_4_ * fVar137;
      auVar119._8_4_ = auVar20._8_4_ * fVar138;
      auVar119._12_4_ = auVar20._12_4_ * fVar139;
      auVar119._16_4_ = fVar140 * 0.0;
      auVar119._20_4_ = fVar141 * 0.0;
      auVar119._24_4_ = fVar171 * 0.0;
      auVar119._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar119,local_5f80,ZEXT1632(auVar18));
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_5dc0,ZEXT1632(auVar19));
      auVar148 = ZEXT1632(CONCAT412(auVar18._12_4_ + auVar104._12_4_ + auVar17._12_4_,
                                    CONCAT48(auVar18._8_4_ + auVar104._8_4_ + auVar17._8_4_,
                                             CONCAT44(auVar18._4_4_ + auVar104._4_4_ + auVar17._4_4_
                                                      ,auVar18._0_4_ +
                                                       auVar104._0_4_ + auVar17._0_4_))));
      auVar149 = ZEXT3264(auVar148);
      local_5ee0 = ZEXT1632(auVar104);
      auVar122 = vminps_avx(local_5ee0,ZEXT1632(auVar17));
      auVar122 = vminps_avx(auVar122,ZEXT1632(auVar18));
      auVar153 = ZEXT3264(local_5c20);
      local_5f00 = vandps_avx(auVar148,local_5c20);
      fVar101 = local_5f00._0_4_ * 1.1920929e-07;
      fVar136 = local_5f00._4_4_ * 1.1920929e-07;
      auVar53._4_4_ = fVar136;
      auVar53._0_4_ = fVar101;
      fVar137 = local_5f00._8_4_ * 1.1920929e-07;
      auVar53._8_4_ = fVar137;
      fVar138 = local_5f00._12_4_ * 1.1920929e-07;
      auVar53._12_4_ = fVar138;
      fVar139 = local_5f00._16_4_ * 1.1920929e-07;
      auVar53._16_4_ = fVar139;
      fVar140 = local_5f00._20_4_ * 1.1920929e-07;
      auVar53._20_4_ = fVar140;
      fVar141 = local_5f00._24_4_ * 1.1920929e-07;
      auVar53._24_4_ = fVar141;
      auVar53._28_4_ = 0x34000000;
      auVar144._0_4_ = (uint)fVar101 ^ local_6000._0_4_;
      auVar144._4_4_ = (uint)fVar136 ^ local_6000._4_4_;
      auVar144._8_4_ = (uint)fVar137 ^ local_6000._8_4_;
      auVar144._12_4_ = (uint)fVar138 ^ local_6000._12_4_;
      auVar144._16_4_ = (uint)fVar139 ^ local_6000._16_4_;
      auVar144._20_4_ = (uint)fVar140 ^ local_6000._20_4_;
      auVar144._24_4_ = (uint)fVar141 ^ local_6000._24_4_;
      auVar144._28_4_ = local_6000._28_4_ ^ 0x34000000;
      auVar122 = vcmpps_avx(auVar122,auVar144,5);
      auVar115 = vmaxps_avx(local_5ee0,ZEXT1632(auVar17));
      auVar134 = vmaxps_avx(auVar115,ZEXT1632(auVar18));
      auVar134 = vcmpps_avx(auVar134,auVar53,2);
      auVar122 = vorps_avx(auVar122,auVar134);
      auVar96 = auVar105 & auVar122;
      local_6060 = auVar105;
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0x7f,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0xbf,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f])
      {
        auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        auVar123 = ZEXT3264(auVar105);
      }
      else {
        auVar54._4_4_ = fVar14 * local_5e60._4_4_;
        auVar54._0_4_ = fVar102 * local_5e60._0_4_;
        auVar54._8_4_ = fVar16 * local_5e60._8_4_;
        auVar54._12_4_ = fVar124 * local_5e60._12_4_;
        auVar54._16_4_ = fVar126 * local_5e60._16_4_;
        auVar54._20_4_ = fVar128 * local_5e60._20_4_;
        auVar54._24_4_ = fVar142 * local_5e60._24_4_;
        auVar54._28_4_ = auVar122._28_4_;
        auVar55._4_4_ = fVar103 * local_5e80._4_4_;
        auVar55._0_4_ = fVar86 * local_5e80._0_4_;
        auVar55._8_4_ = fVar15 * local_5e80._8_4_;
        auVar55._12_4_ = fVar112 * local_5e80._12_4_;
        auVar55._16_4_ = fVar125 * local_5e80._16_4_;
        auVar55._20_4_ = fVar127 * local_5e80._20_4_;
        auVar55._24_4_ = fVar129 * local_5e80._24_4_;
        auVar55._28_4_ = auVar134._28_4_;
        auVar18 = vfmsub213ps_fma(_local_5e80,auVar160,auVar54);
        auVar56._4_4_ = fVar175 * auVar116._4_4_;
        auVar56._0_4_ = fVar172 * auVar116._0_4_;
        auVar56._8_4_ = fVar176 * auVar116._8_4_;
        auVar56._12_4_ = fVar177 * auVar116._12_4_;
        auVar56._16_4_ = fVar178 * auVar116._16_4_;
        auVar56._20_4_ = fVar179 * auVar116._20_4_;
        auVar56._24_4_ = fVar180 * auVar116._24_4_;
        auVar56._28_4_ = 0x34000000;
        auVar57._4_4_ = fVar103 * auVar147._4_4_;
        auVar57._0_4_ = fVar86 * auVar147._0_4_;
        auVar57._8_4_ = fVar15 * auVar147._8_4_;
        auVar57._12_4_ = fVar112 * auVar147._12_4_;
        auVar57._16_4_ = fVar125 * auVar147._16_4_;
        auVar57._20_4_ = fVar127 * auVar147._20_4_;
        auVar57._24_4_ = fVar129 * auVar147._24_4_;
        auVar57._28_4_ = auVar115._28_4_;
        auVar19 = vfmsub213ps_fma(auVar147,local_5ea0,auVar56);
        auVar134 = vandps_avx(auVar54,local_5c20);
        auVar115 = vandps_avx(auVar56,local_5c20);
        auVar134 = vcmpps_avx(auVar134,auVar115,1);
        local_5d40.field_0.x.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar18),auVar134);
        auVar162 = ZEXT3264((undefined1  [32])local_5d40.field_0.x.field_0);
        auVar58._4_4_ = auVar168._4_4_ * fVar14;
        auVar58._0_4_ = auVar168._0_4_ * fVar102;
        auVar58._8_4_ = auVar168._8_4_ * fVar16;
        auVar58._12_4_ = auVar168._12_4_ * fVar124;
        auVar58._16_4_ = auVar168._16_4_ * fVar126;
        auVar58._20_4_ = auVar168._20_4_ * fVar128;
        auVar58._24_4_ = auVar168._24_4_ * fVar142;
        auVar58._28_4_ = auVar134._28_4_;
        auVar18 = vfmsub213ps_fma(auVar168,auVar160,auVar57);
        auVar59._4_4_ = fVar175 * local_5e40._4_4_;
        auVar59._0_4_ = fVar172 * local_5e40._0_4_;
        auVar59._8_4_ = fVar176 * local_5e40._8_4_;
        auVar59._12_4_ = fVar177 * local_5e40._12_4_;
        auVar59._16_4_ = fVar178 * local_5e40._16_4_;
        auVar59._20_4_ = fVar179 * local_5e40._20_4_;
        auVar59._24_4_ = fVar180 * local_5e40._24_4_;
        auVar59._28_4_ = auVar115._28_4_;
        auVar19 = vfmsub213ps_fma(local_5e60,auVar164,auVar59);
        auVar134 = vandps_avx(auVar59,local_5c20);
        auVar115 = vandps_avx(auVar57,local_5c20);
        auVar134 = vcmpps_avx(auVar134,auVar115,1);
        local_5d40.field_0.y.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19),auVar134);
        auVar18 = vfmsub213ps_fma(local_5e40,local_5ea0,auVar55);
        auVar19 = vfmsub213ps_fma(auVar116,auVar164,auVar58);
        auVar134 = vandps_avx(auVar55,local_5c20);
        auVar115 = vandps_avx(auVar58,local_5c20);
        auVar134 = vcmpps_avx(auVar134,auVar115,1);
        local_5d40.field_0.z.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar19),ZEXT1632(auVar18),auVar134);
        auVar149 = ZEXT3264((undefined1  [32])local_5d40.field_0.z.field_0);
        local_6020._0_4_ = auVar73._0_4_;
        local_6020._4_4_ = auVar73._4_4_;
        fStack_6018 = auVar73._8_4_;
        fStack_6014 = auVar73._12_4_;
        fStack_6010 = auVar73._16_4_;
        fStack_600c = auVar73._20_4_;
        fStack_6008 = auVar73._24_4_;
        auVar60._4_4_ = local_5d40._68_4_ * (float)local_6020._4_4_;
        auVar60._0_4_ = local_5d40._64_4_ * (float)local_6020._0_4_;
        auVar60._8_4_ = local_5d40._72_4_ * fStack_6018;
        auVar60._12_4_ = local_5d40._76_4_ * fStack_6014;
        auVar60._16_4_ = local_5d40._80_4_ * fStack_6010;
        auVar60._20_4_ = local_5d40._84_4_ * fStack_600c;
        auVar60._24_4_ = local_5d40._88_4_ * fStack_6008;
        auVar60._28_4_ = auVar134._28_4_;
        auVar18 = vfmadd213ps_fma(local_5f80,(undefined1  [32])local_5d40.field_0.y.field_0,auVar60)
        ;
        auVar18 = vfmadd213ps_fma(local_5dc0,(undefined1  [32])local_5d40.field_0.x.field_0,
                                  ZEXT1632(auVar18));
        fVar86 = auVar18._0_4_ + auVar18._0_4_;
        fVar101 = auVar18._4_4_ + auVar18._4_4_;
        fVar102 = auVar18._8_4_ + auVar18._8_4_;
        fVar103 = auVar18._12_4_ + auVar18._12_4_;
        auVar116 = ZEXT1632(CONCAT412(fVar103,CONCAT48(fVar102,CONCAT44(fVar101,fVar86))));
        auVar120._0_4_ = local_5d40._64_4_ * fVar85;
        auVar120._4_4_ = local_5d40._68_4_ * fVar8;
        auVar120._8_4_ = local_5d40._72_4_ * fVar9;
        auVar120._12_4_ = local_5d40._76_4_ * fVar10;
        auVar120._16_4_ = local_5d40._80_4_ * fVar11;
        auVar120._20_4_ = local_5d40._84_4_ * fVar12;
        auVar120._24_4_ = local_5d40._88_4_ * fVar13;
        auVar120._28_4_ = 0;
        auVar18 = vfmadd213ps_fma(local_5e00,(undefined1  [32])local_5d40.field_0.y.field_0,auVar120
                                 );
        auVar19 = vfmadd213ps_fma(local_5de0,(undefined1  [32])local_5d40.field_0.x.field_0,
                                  ZEXT1632(auVar18));
        auVar134 = vrcpps_avx(auVar116);
        auVar151._8_4_ = 0x3f800000;
        auVar151._0_8_ = 0x3f8000003f800000;
        auVar151._12_4_ = 0x3f800000;
        auVar151._16_4_ = 0x3f800000;
        auVar151._20_4_ = 0x3f800000;
        auVar151._24_4_ = 0x3f800000;
        auVar151._28_4_ = 0x3f800000;
        auVar18 = vfnmadd213ps_fma(auVar134,auVar116,auVar151);
        auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar134,auVar134);
        local_5ce0 = ZEXT1632(CONCAT412((auVar19._12_4_ + auVar19._12_4_) * auVar18._12_4_,
                                        CONCAT48((auVar19._8_4_ + auVar19._8_4_) * auVar18._8_4_,
                                                 CONCAT44((auVar19._4_4_ + auVar19._4_4_) *
                                                          auVar18._4_4_,
                                                          (auVar19._0_4_ + auVar19._0_4_) *
                                                          auVar18._0_4_))));
        auVar134 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_5ce0,2);
        auVar115 = vcmpps_avx(local_5ce0,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar134 = vandps_avx(auVar134,auVar115);
        auVar145._0_4_ = (uint)fVar86 ^ local_6000._0_4_;
        auVar145._4_4_ = (uint)fVar101 ^ local_6000._4_4_;
        auVar145._8_4_ = (uint)fVar102 ^ local_6000._8_4_;
        auVar145._12_4_ = (uint)fVar103 ^ local_6000._12_4_;
        auVar145._16_4_ = local_6000._16_4_;
        auVar145._20_4_ = local_6000._20_4_;
        auVar145._24_4_ = local_6000._24_4_;
        auVar145._28_4_ = local_6000._28_4_;
        auVar115 = vcmpps_avx(auVar116,auVar145,4);
        auVar134 = vandps_avx(auVar115,auVar134);
        auVar123 = ZEXT3264(auVar105);
        auVar105 = vandps_avx(auVar105,auVar122);
        auVar134 = vpslld_avx2(auVar134,0x1f);
        auVar115 = vpsrad_avx2(auVar134,0x1f);
        auVar134 = auVar105 & auVar115;
        local_5f20 = auVar148;
        local_5ec0 = auVar122;
        if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar134 >> 0x7f,0) == '\0') &&
              (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar134 >> 0xbf,0) == '\0') &&
            (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar134[0x1f]) {
          auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          auVar122 = vandps_avx(auVar115,auVar105);
          uVar3 = *(uint *)(lVar76 + local_6098);
          pGVar5 = (context->scene->geometries).items[uVar3].ptr;
          uVar2 = pGVar5->mask;
          auVar135._4_4_ = uVar2;
          auVar135._0_4_ = uVar2;
          auVar135._8_4_ = uVar2;
          auVar135._12_4_ = uVar2;
          auVar135._16_4_ = uVar2;
          auVar135._20_4_ = uVar2;
          auVar135._24_4_ = uVar2;
          auVar135._28_4_ = uVar2;
          auVar105 = vpand_avx2(auVar135,*(undefined1 (*) [32])(ray + 0x120));
          auVar134 = vpcmpeqd_avx2(auVar105,_DAT_01f7b000);
          auVar105 = auVar122 & ~auVar134;
          auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          unaff_R12 = local_60a0;
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar105 >> 0x7f,0) != '\0') ||
                (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0xbf,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar105[0x1f] < '\0') {
            local_6000._0_4_ = *(undefined4 *)(lVar76 + 0x10 + local_6098);
            auVar122 = vandnps_avx(auVar134,auVar122);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar105 = vrcpps_avx(auVar148);
              auVar146._8_4_ = 0x3f800000;
              auVar146._0_8_ = 0x3f8000003f800000;
              auVar146._12_4_ = 0x3f800000;
              auVar146._16_4_ = 0x3f800000;
              auVar146._20_4_ = 0x3f800000;
              auVar146._24_4_ = 0x3f800000;
              auVar146._28_4_ = 0x3f800000;
              auVar18 = vfnmadd213ps_fma(auVar148,auVar105,auVar146);
              auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar105,auVar105);
              auVar99._8_4_ = 0x219392ef;
              auVar99._0_8_ = 0x219392ef219392ef;
              auVar99._12_4_ = 0x219392ef;
              auVar99._16_4_ = 0x219392ef;
              auVar99._20_4_ = 0x219392ef;
              auVar99._24_4_ = 0x219392ef;
              auVar99._28_4_ = 0x219392ef;
              auVar105 = vcmpps_avx(local_5f00,auVar99,5);
              auVar105 = vandps_avx(auVar105,ZEXT1632(auVar18));
              auVar63._4_4_ = auVar105._4_4_ * auVar104._4_4_;
              auVar63._0_4_ = auVar105._0_4_ * auVar104._0_4_;
              auVar63._8_4_ = auVar105._8_4_ * auVar104._8_4_;
              auVar63._12_4_ = auVar105._12_4_ * auVar104._12_4_;
              auVar63._16_4_ = auVar105._16_4_ * 0.0;
              auVar63._20_4_ = auVar105._20_4_ * 0.0;
              auVar63._24_4_ = auVar105._24_4_ * 0.0;
              auVar63._28_4_ = local_5f00._28_4_;
              auVar134 = vminps_avx(auVar63,auVar146);
              auVar64._4_4_ = auVar17._4_4_ * auVar105._4_4_;
              auVar64._0_4_ = auVar17._0_4_ * auVar105._0_4_;
              auVar64._8_4_ = auVar17._8_4_ * auVar105._8_4_;
              auVar64._12_4_ = auVar17._12_4_ * auVar105._12_4_;
              auVar64._16_4_ = auVar105._16_4_ * 0.0;
              auVar64._20_4_ = auVar105._20_4_ * 0.0;
              auVar64._24_4_ = auVar105._24_4_ * 0.0;
              auVar64._28_4_ = auVar105._28_4_;
              auVar105 = vminps_avx(auVar64,auVar146);
              auVar115 = vsubps_avx(auVar146,auVar134);
              auVar116 = vsubps_avx(auVar146,auVar105);
              auVar68._8_8_ = uStack_59b8;
              auVar68._0_8_ = local_59c0;
              auVar68._16_8_ = uStack_59b0;
              auVar68._24_8_ = uStack_59a8;
              local_5ca0 = vblendvps_avx(auVar134,auVar115,auVar68);
              local_5cc0 = vblendvps_avx(auVar105,auVar116,auVar68);
              local_6090.valid = local_5c00;
              local_6090.geometryUserPtr = &local_5da0;
              local_6090.context = local_5d80;
              local_6090.ray = local_5d60;
              auVar149 = ZEXT1664(local_5d40._64_16_);
              auVar153 = ZEXT1664(local_5c20._0_16_);
              auVar162 = ZEXT1664(local_5d40._0_16_);
              _local_6020 = auVar122;
              std::
              _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
              ::
              _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                        ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                          *)&local_6090,
                         (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                          *)&local_5d40.field_0);
              pRVar6 = context->user;
              local_5ca0._4_4_ = local_6000._0_4_;
              local_5ca0._0_4_ = local_6000._0_4_;
              local_5ca0._8_4_ = local_6000._0_4_;
              local_5ca0._12_4_ = local_6000._0_4_;
              local_5ca0._16_4_ = local_6000._0_4_;
              local_5ca0._20_4_ = local_6000._0_4_;
              local_5ca0._24_4_ = local_6000._0_4_;
              local_5ca0._28_4_ = local_6000._0_4_;
              auVar105 = vpcmpeqd_avx2(local_5ca0,local_5ca0);
              local_5fc8[1] = auVar105;
              *local_5fc8 = auVar105;
              local_5c60 = pRVar6->instID[0];
              local_5c40 = pRVar6->instPrimID[0];
              local_6000 = *(undefined1 (*) [32])(ray + 0x100);
              auVar122 = vblendvps_avx(local_6000,(undefined1  [32])local_5da0,_local_6020);
              *(undefined1 (*) [32])(ray + 0x100) = auVar122;
              local_5fc0 = _local_6020;
              local_6090.valid = (int *)local_5fc0;
              local_6090.geometryUserPtr = pGVar5->userPtr;
              local_6090.context = context->user;
              local_6090.hit = (RTCHitN *)&local_5d40;
              local_6090.N = 8;
              local_6090.ray = (RTCRayN *)ray;
              local_5c80 = uVar3;
              uStack_5c7c = uVar3;
              uStack_5c78 = uVar3;
              uStack_5c74 = uVar3;
              uStack_5c70 = uVar3;
              uStack_5c6c = uVar3;
              uStack_5c68 = uVar3;
              uStack_5c64 = uVar3;
              uStack_5c5c = local_5c60;
              uStack_5c58 = local_5c60;
              uStack_5c54 = local_5c60;
              uStack_5c50 = local_5c60;
              uStack_5c4c = local_5c60;
              uStack_5c48 = local_5c60;
              uStack_5c44 = local_5c60;
              uStack_5c3c = local_5c40;
              uStack_5c38 = local_5c40;
              uStack_5c34 = local_5c40;
              uStack_5c30 = local_5c40;
              uStack_5c2c = local_5c40;
              uStack_5c28 = local_5c40;
              uStack_5c24 = local_5c40;
              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar149 = ZEXT1664(auVar149._0_16_);
                auVar153 = ZEXT1664(auVar153._0_16_);
                auVar162 = ZEXT1664(auVar162._0_16_);
                (*pGVar5->occlusionFilterN)(&local_6090);
                auVar166._8_56_ = extraout_var_00;
                auVar166._0_8_ = extraout_XMM1_Qa_00;
                auVar105 = vpcmpeqd_avx2(auVar166._0_32_,auVar166._0_32_);
              }
              unaff_R12 = local_60a0;
              auVar122 = vpcmpeqd_avx2(local_5fc0,_DAT_01f7b000);
              auVar134 = auVar105 & ~auVar122;
              if ((((((((auVar134 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar134 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar134 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar134 >> 0x7f,0) == '\0') &&
                    (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar134 >> 0xbf,0) == '\0') &&
                  (auVar134 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar134[0x1f]) {
                auVar122 = auVar122 ^ auVar105;
                auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              }
              else {
                p_Var7 = context->args->filter;
                if (p_Var7 == (RTCFilterFunctionN)0x0) {
                  auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                }
                else {
                  auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0)
                     ) {
                    auVar149 = ZEXT1664(auVar149._0_16_);
                    auVar153 = ZEXT1664(auVar153._0_16_);
                    auVar162 = ZEXT1664(auVar162._0_16_);
                    (*p_Var7)(&local_6090);
                    auVar170 = ZEXT3264(CONCAT428(0x3f800003,
                                                  CONCAT424(0x3f800003,
                                                            CONCAT420(0x3f800003,
                                                                      CONCAT416(0x3f800003,
                                                                                CONCAT412(0x3f800003
                                                                                          ,CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                    auVar169 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                  CONCAT424(0x3f7ffffa,
                                                            CONCAT420(0x3f7ffffa,
                                                                      CONCAT416(0x3f7ffffa,
                                                                                CONCAT412(0x3f7ffffa
                                                                                          ,CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                    auVar166 = ZEXT3264(CONCAT428(0x7f800000,
                                                  CONCAT424(0x7f800000,
                                                            CONCAT420(0x7f800000,
                                                                      CONCAT416(0x7f800000,
                                                                                CONCAT412(0x7f800000
                                                                                          ,CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  }
                }
                auVar105 = vpcmpeqd_avx2(local_5fc0,_DAT_01f7b000);
                auVar122 = auVar105 ^ _DAT_01f7b020;
                auVar110._8_4_ = 0xff800000;
                auVar110._0_8_ = 0xff800000ff800000;
                auVar110._12_4_ = 0xff800000;
                auVar110._16_4_ = 0xff800000;
                auVar110._20_4_ = 0xff800000;
                auVar110._24_4_ = 0xff800000;
                auVar110._28_4_ = 0xff800000;
                auVar105 = vblendvps_avx(auVar110,*(undefined1 (*) [32])(local_6090.ray + 0x100),
                                         auVar105);
                *(undefined1 (*) [32])(local_6090.ray + 0x100) = auVar105;
              }
              auVar105 = vblendvps_avx(local_6000,*(undefined1 (*) [32])local_6030,auVar122);
              *(undefined1 (*) [32])local_6030 = auVar105;
            }
            auVar105 = vandnps_avx(auVar122,local_6060);
            auVar122 = local_6060 & ~auVar122;
            auVar123 = ZEXT3264(auVar105);
            if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar122 >> 0x7f,0) == '\0') &&
                  (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar122 >> 0xbf,0) == '\0') &&
                (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar122[0x1f]) break;
          }
        }
      }
      lVar78 = local_6098 + 4;
    }
    auVar123 = ZEXT3264(local_5f40);
    auVar134 = vandps_avx(auVar105,local_5f40);
    unaff_R12 = unaff_R12 + 1;
    lVar76 = lVar76 + 0x60;
    auVar105 = local_5f40 & auVar105;
    auVar122 = local_5f40;
    local_5f40 = auVar134;
  } while ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar105 >> 0x7f,0) != '\0') ||
             (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar105 >> 0xbf,0) != '\0') ||
           (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar105[0x1f] < '\0');
  auVar122 = vpcmpeqd_avx2(auVar122,auVar122);
  auVar100._0_4_ = local_5f40._0_4_ ^ auVar122._0_4_;
  auVar100._4_4_ = local_5f40._4_4_ ^ auVar122._4_4_;
  auVar100._8_4_ = local_5f40._8_4_ ^ auVar122._8_4_;
  auVar100._12_4_ = local_5f40._12_4_ ^ auVar122._12_4_;
  auVar100._16_4_ = local_5f40._16_4_ ^ auVar122._16_4_;
  auVar100._20_4_ = local_5f40._20_4_ ^ auVar122._20_4_;
  auVar100._24_4_ = local_5f40._24_4_ ^ auVar122._24_4_;
  auVar100._28_4_ = local_5f40._28_4_ ^ auVar122._28_4_;
  local_5f60 = vorps_avx(auVar100,local_5f60);
  auVar122 = auVar122 & ~local_5f60;
  if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar122 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar122 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar122 >> 0x7f,0) == '\0') &&
        (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar122 >> 0xbf,0) == '\0') &&
      (auVar122 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar122[0x1f])
  goto LAB_016a8e4a;
  auVar121._8_4_ = 0xff800000;
  auVar121._0_8_ = 0xff800000ff800000;
  auVar121._12_4_ = 0xff800000;
  auVar121._16_4_ = 0xff800000;
  auVar121._20_4_ = 0xff800000;
  auVar121._24_4_ = 0xff800000;
  auVar121._28_4_ = 0xff800000;
  auVar123 = ZEXT3264(auVar121);
  local_5a00 = vblendvps_avx(local_5a00,auVar121,local_5f60);
  goto LAB_016a7896;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }